

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marketgenerator.cpp
# Opt level: O1

void __thiscall hedg::MarketGenerator::generate(MarketGenerator *this)

{
  mutex *__mutex;
  char cVar1;
  pointer pcVar2;
  execution_context eVar3;
  _func_int ***ppp_Var4;
  execution_context eVar5;
  undefined8 __n;
  int iVar6;
  uint uVar7;
  void *pvVar8;
  void *pvVar9;
  void **ppvVar10;
  void **ppvVar11;
  uint *puVar12;
  int *piVar13;
  undefined8 *puVar14;
  time_unit t;
  uint uVar15;
  uint uVar16;
  int iVar17;
  string *in_RCX;
  string *end_time_;
  ulong uVar18;
  uint *puVar19;
  uint *puVar20;
  int iVar21;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *extraout_RDX_05;
  void *extraout_RDX_06;
  void *extraout_RDX_07;
  void *extraout_RDX_08;
  service *psVar22;
  char *pcVar23;
  char *pcVar24;
  bool bVar25;
  int iVar26;
  uint *puVar27;
  uint *puVar28;
  byte bVar29;
  bool bVar30;
  string *end_point_;
  ulong uVar31;
  long lVar32;
  uint uVar33;
  ulong uVar34;
  uint *puVar35;
  bool bVar36;
  uint local_8c0;
  uint local_8bc;
  uint local_8b8;
  uint local_8b4;
  uint *local_898;
  void *local_838;
  uint *puStack_830;
  undefined1 *local_828;
  void *pvStack_820;
  undefined8 local_818;
  uint *puStack_810;
  undefined1 local_808;
  int local_800;
  void *local_7f8;
  io_service service;
  undefined1 local_7c8 [8];
  long *local_7c0;
  service_type *psStack_7b8;
  undefined8 local_7b0;
  undefined8 local_7a8;
  void *local_7a0;
  void *pvStack_798;
  void **local_790;
  string country_code;
  string event_type;
  string m_tm;
  string local_728;
  string local_708;
  string m_id;
  string local_6c8;
  string local_6a8;
  string local_688;
  string local_668;
  string local_648;
  string local_628;
  string local_608;
  string local_5e8;
  string local_5c8;
  string local_5a8;
  string end_time;
  string start_time;
  Market_Projection local_538;
  undefined1 local_4d8 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a8;
  _Alloc_hider local_498;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_488;
  _Alloc_hider local_478;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_468;
  context context;
  system_error e;
  market_catalogue local_150;
  
  __mutex = &this->mut_;
  iVar6 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar6 != 0) {
LAB_0016045c:
    std::__throw_system_error(iVar6);
  }
  local_8c0 = (int)this + 0x28;
  local_8bc = local_8c0;
  local_8b8 = local_8c0;
  local_8b4 = local_8c0;
  do {
    t = (time_unit)in_RCX;
    Betfair_Auth::get_session_id_abi_cxx11_();
    std::__cxx11::string::operator=((string *)this,(string *)&e);
    if ((error_code *)e._0_8_ != &e.m_error_code) {
      operator_delete((void *)e._0_8_,e.m_error_code._0_8_ + 1);
    }
    Timing::now_abi_cxx11_();
    Timing::after_abi_cxx11_(&end_time,(Timing *)(long)this->time_span_,(ulong)this->time_unit_,t);
    boost::asio::io_context::io_context(&service);
    boost::asio::ssl::context::context(&context,tlsv12_client);
    Client<hedg::Rest_Client>::Client
              ((Client<hedg::Rest_Client> *)&e,(string *)config::betting_host_abi_cxx11_,
               (string *)config::betting_port_abi_cxx11_,&service,&context);
    local_5e8._M_dataplus._M_p = (pointer)&local_5e8.field_2;
    pcVar2 = (this->session_id_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_5e8,pcVar2,pcVar2 + (this->session_id_)._M_string_length);
    local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_608,start_time._M_dataplus._M_p,
               start_time._M_dataplus._M_p + start_time._M_string_length);
    local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_628,end_time._M_dataplus._M_p,
               end_time._M_dataplus._M_p + end_time._M_string_length);
    local_648._M_dataplus._M_p = (pointer)&local_648.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_648,config::market_catalogue_endpoint_abi_cxx11_,
               DAT_001f8808 + config::market_catalogue_endpoint_abi_cxx11_);
    local_668._M_dataplus._M_p = (pointer)&local_668.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_668,config::event_type_ids_abi_cxx11_,
               DAT_001f8928 + config::event_type_ids_abi_cxx11_);
    local_688._M_dataplus._M_p = (pointer)&local_688.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_688,config::market_type_codes_abi_cxx11_,
               DAT_001f8768 + config::market_type_codes_abi_cxx11_);
    local_6a8._M_dataplus._M_p = (pointer)&local_6a8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_6a8,config::market_countries_abi_cxx11_,
               DAT_001f8948 + config::market_countries_abi_cxx11_);
    local_6c8._M_dataplus._M_p = (pointer)&local_6c8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_6c8,config::max_results_abi_cxx11_,
               DAT_001f87a8 + config::max_results_abi_cxx11_);
    local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_5a8,config::market_projection_abi_cxx11_,
               DAT_001f87e8 + config::market_projection_abi_cxx11_);
    end_time_ = &local_628;
    end_point_ = &local_648;
    params::market_catalogue::market_catalogue
              (&local_150,&local_5e8,&local_608,end_time_,end_point_,&local_668,&local_688,
               &local_6a8,&local_6c8,&local_5a8);
    iVar6 = (int)end_point_;
    Client<hedg::Rest_Client>::
    send_request<boost::beast::http::message<true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>,hedg::params::market_catalogue>
              ((Client<hedg::Rest_Client> *)&e,rest::message<hedg::params::market_catalogue>,
               &local_150);
    params::market_catalogue::~market_catalogue(&local_150);
    pvVar8 = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
      operator_delete(local_5a8._M_dataplus._M_p,local_5a8.field_2._M_allocated_capacity + 1);
      pvVar8 = extraout_RDX_00;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6c8._M_dataplus._M_p != &local_6c8.field_2) {
      operator_delete(local_6c8._M_dataplus._M_p,local_6c8.field_2._M_allocated_capacity + 1);
      pvVar8 = extraout_RDX_01;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6a8._M_dataplus._M_p != &local_6a8.field_2) {
      operator_delete(local_6a8._M_dataplus._M_p,local_6a8.field_2._M_allocated_capacity + 1);
      pvVar8 = extraout_RDX_02;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_688._M_dataplus._M_p != &local_688.field_2) {
      operator_delete(local_688._M_dataplus._M_p,local_688.field_2._M_allocated_capacity + 1);
      pvVar8 = extraout_RDX_03;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_668._M_dataplus._M_p != &local_668.field_2) {
      operator_delete(local_668._M_dataplus._M_p,local_668.field_2._M_allocated_capacity + 1);
      pvVar8 = extraout_RDX_04;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_648._M_dataplus._M_p != &local_648.field_2) {
      operator_delete(local_648._M_dataplus._M_p,local_648.field_2._M_allocated_capacity + 1);
      pvVar8 = extraout_RDX_05;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_628._M_dataplus._M_p != &local_628.field_2) {
      operator_delete(local_628._M_dataplus._M_p,local_628.field_2._M_allocated_capacity + 1);
      pvVar8 = extraout_RDX_06;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_608._M_dataplus._M_p != &local_608.field_2) {
      operator_delete(local_608._M_dataplus._M_p,local_608.field_2._M_allocated_capacity + 1);
      pvVar8 = extraout_RDX_07;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
      operator_delete(local_5e8._M_dataplus._M_p,local_5e8.field_2._M_allocated_capacity + 1);
      pvVar8 = extraout_RDX_08;
    }
    Rest_Client::recv_abi_cxx11_
              ((Rest_Client *)local_4d8,(int)(Client<hedg::Rest_Client> *)&e,pvVar8,
               (size_t)end_time_,iVar6);
    __n = local_4d8._8_8_;
    if (((ulong)local_4d8._8_8_ < (service_type *)0xffffffffffffffe0) &&
       (pvVar8 = operator_new__((ulong)&(((execution_context_service_base<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>_>
                                           *)local_4d8._8_8_)->super_service).next_,
                                (nothrow_t *)&std::nothrow), pvVar8 != (void *)0x0)) {
      puVar14 = (undefined8 *)
                ((long)pvVar8 +
                (long)&(((execution_context_service_base<boost::asio::detail::reactive_socket_service<boost::asio::ip::tcp>_>
                          *)__n)->super_service).key_.id_);
      *puVar14 = 0;
      puVar14[1] = 0;
      *(undefined8 *)((long)pvVar8 + __n) = 0;
      ((undefined8 *)((long)pvVar8 + __n))[1] = 0;
    }
    else {
      pvVar8 = (void *)0x0;
    }
    if (pvVar8 != (void *)0x0) {
      memcpy(pvVar8,(void *)local_4d8._0_8_,__n);
    }
    local_7f8 = pvVar8;
    if ((undefined1 *)local_4d8._0_8_ != local_4d8 + 0x10) {
      operator_delete((void *)local_4d8._0_8_,local_4d8._16_8_ + 1);
    }
    local_7c8[0] = 1;
    local_7c0 = (long *)0x0;
    psStack_7b8 = (service_type *)0x0;
    local_7b0 = 0xffffffff;
    local_7a8 = 0x400;
    local_7a0 = (void *)0x0;
    pvStack_798 = (void *)0x0;
    iVar6 = 1;
    if ((ulong)__n >> 0x20 == 0) {
      psStack_7b8 = (service_type *)0x0;
      local_7a0 = operator_new__((ulong)(__n * 5) / 3 + 0x5f & 0x7ffffffc0,
                                 (nothrow_t *)&std::nothrow);
      pvVar9 = operator_new__(0x2000,(nothrow_t *)&std::nothrow);
      pvVar8 = pvStack_798;
      bVar36 = pvStack_798 != (void *)0x0;
      pvStack_798 = pvVar9;
      if (bVar36) {
        operator_delete__(pvVar8);
      }
      if (local_7c0 == (long *)0x0) {
        iVar6 = (**(code **)(*simdjson::active_implementation + 0x18))
                          (simdjson::active_implementation,__n,0x400,&local_7c0);
      }
      else {
        iVar6 = (**(code **)(*local_7c0 + 0x20))(local_7c0,__n);
        if (iVar6 != 0) goto LAB_0015b4ac;
        iVar6 = (**(code **)(*local_7c0 + 0x28))(local_7c0,0x400);
      }
      if (iVar6 == 0) {
        psStack_7b8 = (service_type *)__n;
        local_7a8 = 0x400;
        iVar6 = 0;
      }
    }
LAB_0015b4ac:
    pvVar8 = local_7f8;
    if (iVar6 == 0) {
      local_800 = (**(code **)(*local_7c0 + 8))(local_7c0,local_7f8,__n,0);
      if (local_800 == 0) {
        local_838 = pvVar8;
        puStack_830 = (uint *)local_7c0[2];
        local_828 = local_7c8;
        pvStack_820 = local_7a0;
        local_818 = 0x100000000;
        puStack_810 = (uint *)local_7c0[2];
        local_808 = 0;
        local_800 = 0;
      }
      else {
        local_818 = 0;
        puStack_810 = (uint *)0x0;
        local_828 = (undefined1 *)0x0;
        pvStack_820 = (void *)0x0;
        local_838 = (void *)0x0;
        puStack_830 = (uint *)0x0;
        local_808 = 0;
      }
    }
    else {
      local_818 = 0;
      puStack_810 = (uint *)0x0;
      local_828 = (undefined1 *)0x0;
      pvStack_820 = (void *)0x0;
      local_838 = (void *)0x0;
      puStack_830 = (uint *)0x0;
      local_808 = 0;
      local_800 = iVar6;
    }
    local_808 = 0;
    puStack_830 = puStack_810;
    iVar6 = local_800;
    if (local_800 == 0) {
      local_898 = puStack_810;
      if (local_818._4_4_ != 1) {
LAB_001608c5:
        __assert_fail("_json_iter->_depth == _depth",
                      "/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/simdjson/simdjson.h"
                      ,0x675c,
                      "void simdjson::fallback::ondemand::value_iterator::assert_at_start() const");
      }
      iVar6 = 0x10;
      if (*(char *)((long)local_838 + (ulong)*puStack_810) == '[') {
        puStack_830 = puStack_810 + 1;
        iVar6 = 0;
      }
      if (iVar6 == 0) {
        iVar6 = *(int *)(*(long *)(local_828 + 8) + 8);
        if (iVar6 == 0) {
          __assert_fail("n_structural_indexes > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/simdjson/simdjson.h"
                        ,0x63ce,
                        "token_position simdjson::fallback::ondemand::json_iterator::last_position() const"
                       );
        }
        if (*(char *)((long)local_838 +
                     (ulong)*(uint *)(*(long *)(*(long *)(local_828 + 8) + 0x10) +
                                     (ulong)(iVar6 - 1) * 4)) == ']') {
          if (puStack_830 != puStack_810 + 1) {
LAB_00160767:
            __assert_fail("_json_iter->token._position == _start_position + 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/simdjson/simdjson.h"
                          ,0x6761,
                          "void simdjson::fallback::ondemand::value_iterator::assert_at_container_start() const"
                         );
          }
          if (*(char *)((long)local_838 + (ulong)*puStack_830) == ']') {
            puStack_830 = puStack_830 + 1;
            local_818 = 0;
          }
          else {
            local_818 = 0x200000000;
            *(uint **)(*(long *)(local_828 + 0x30) + 8) = puStack_810;
          }
          iVar6 = 0;
        }
        else {
          local_828 = (undefined1 *)0x0;
          local_818 = 0x1b;
          iVar6 = 0x1b;
        }
      }
      bVar36 = iVar6 == 0;
      if (bVar36) {
        iVar6 = 0;
        ppvVar11 = &local_838;
      }
      else {
        local_898 = (uint *)0x0;
        ppvVar11 = (void **)0x0;
      }
      uVar7 = (uint)bVar36;
      if (iVar6 != 0) goto LAB_0015b748;
      if (((long)ppvVar11[1] - (long)local_898 != 8) && ((long)ppvVar11[1] - (long)local_898 != 4))
      {
        iVar6 = 0x19;
        goto LAB_0015b748;
      }
      iVar6 = 0;
      if (ppvVar11 == (void **)0x0) {
        __assert_fail("_json_iter != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/simdjson/simdjson.h"
                      ,0x6791,
                      "void simdjson::fallback::ondemand::value_iterator::assert_is_valid() const");
      }
    }
    else {
LAB_0015b748:
      local_898 = (uint *)0x0;
      uVar7 = 0;
      ppvVar11 = (void **)0x0;
    }
    uVar15 = uVar7 + 1;
    in_RCX = (string *)(ulong)uVar15;
    local_790 = ppvVar11;
LAB_0015b76c:
    ppvVar11 = local_790;
LAB_0015b77c:
    bVar36 = iVar6 != 0;
    if (ppvVar11 != (void **)0x0) {
      bVar36 = (int)uVar7 <= *(int *)((long)ppvVar11 + 0x24);
    }
    if (bVar36) {
      iVar21 = iVar6;
      if (iVar6 == 0) {
        if (*(int *)(ppvVar11 + 4) != 0) {
          ppvVar11[2] = (void *)0x0;
          *(undefined4 *)((long)ppvVar11 + 0x24) = 0;
          iVar21 = *(int *)(ppvVar11 + 4);
          goto LAB_0015b7c0;
        }
        puVar12 = (uint *)ppvVar11[1];
        if (puVar12 <= local_898) goto LAB_001609de;
        uVar18 = (ulong)uVar15;
        if (*(uint *)((long)ppvVar11 + 0x24) != uVar15) goto LAB_001609ff;
        iVar21 = 0;
        if (uVar7 == 0) goto LAB_00160a23;
      }
      else {
LAB_0015b7c0:
        puVar12 = (uint *)0x0;
        uVar18 = 0;
        ppvVar11 = (void **)0x0;
      }
      if (iVar21 != 0) {
        puVar14 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar14 = &PTR__exception_001f1e70;
        *(int *)(puVar14 + 1) = iVar21;
        __cxa_throw(puVar14,&simdjson::simdjson_error::typeinfo,std::exception::~exception);
      }
      puVar20 = (uint *)ppvVar11[1];
      iVar21 = (int)uVar18;
      if (puVar20 == puVar12) {
        if (*(int *)((long)ppvVar11 + 0x24) != iVar21) goto LAB_001608c5;
        if (iVar21 == 0) goto LAB_001608ee;
        iVar26 = 0x10;
        if (*(char *)((long)*ppvVar11 + (ulong)*puVar20) == '{') {
          ppvVar11[1] = puVar20 + 1;
          iVar26 = 0;
        }
      }
      else if (((long)puVar20 - (long)puVar12 == 8) ||
              (iVar26 = 0x19, (long)puVar20 - (long)puVar12 == 4)) {
        iVar26 = (uint)(*(char *)((long)*ppvVar11 + (ulong)*puVar12) != '{') << 4;
      }
      if (iVar26 == 0) {
        if ((uint *)ppvVar11[1] != puVar12 + 1) goto LAB_00160767;
        if (*(int *)((long)ppvVar11 + 0x24) != iVar21) goto LAB_0016072f;
        if (iVar21 == 0) goto LAB_00160a89;
        *(uint **)(*(long *)((long)ppvVar11[2] + 0x30) + uVar18 * 8) = puVar12;
        if (*(char *)((long)*ppvVar11 + (ulong)*ppvVar11[1]) == '}') {
          ppvVar11[1] = (uint *)((long)ppvVar11[1] + 4);
          *(int *)((long)ppvVar11 + 0x24) = iVar21 + -1;
        }
        iVar26 = 0;
      }
      if (iVar26 == 0) {
        iVar26 = 0;
      }
      else {
        puVar12 = (uint *)0x0;
        uVar18 = 0;
        ppvVar11 = (void **)0x0;
      }
      if (iVar26 != 0) {
        puVar14 = (undefined8 *)__cxa_allocate_exception(0x10);
        *puVar14 = &PTR__exception_001f1e70;
        *(int *)(puVar14 + 1) = iVar26;
        __cxa_throw(puVar14,&simdjson::simdjson_error::typeinfo,std::exception::~exception);
      }
      puVar20 = (uint *)ppvVar11[1];
      if (puVar20 <= puVar12) goto LAB_00160585;
      puVar28 = puVar12 + 1;
      iVar21 = (int)uVar18;
      if (puVar20 == puVar28) {
        uVar34 = 1;
        bVar36 = true;
LAB_0015b96c:
        uVar16 = iVar21 - 1;
        do {
          local_8b4 = (uint)uVar34;
          if ((uVar34 & 1) == 0) {
            if (bVar36) goto LAB_0015bc2d;
            *(int *)((long)ppvVar11 + 0x24) = iVar21;
            ppvVar11[1] = puVar28;
            if (iVar21 == 0) goto LAB_00160a89;
            *(uint **)(*(long *)((long)ppvVar11[2] + 0x30) + uVar18 * 8) = puVar12;
            pvVar8 = *ppvVar11;
            local_8b4 = 1;
            if (*(char *)((long)pvVar8 + (ulong)*ppvVar11[1]) != '}') goto LAB_0015bd26;
            ppvVar11[1] = (uint *)((long)ppvVar11[1] + 4);
            if (0x7ffffffd < uVar16) goto LAB_00160560;
            *(uint *)((long)ppvVar11 + 0x24) = uVar16;
            local_8b4 = 0;
            goto LAB_0015bd26;
          }
          if (*(int *)((long)ppvVar11 + 0x24) != iVar21) goto LAB_0016047e;
          puVar19 = (uint *)ppvVar11[1];
          if (puVar19 <= puVar12) goto LAB_0016051c;
          if (iVar21 == 0) goto LAB_0016049f;
          pvVar8 = *ppvVar11;
          ppvVar11[1] = puVar19 + 1;
          uVar31 = (ulong)*puVar19;
          if (*(char *)((long)pvVar8 + uVar31) != '\"') {
            *(undefined4 *)(ppvVar11 + 4) = 3;
            uVar31 = 0x300000000;
            goto LAB_0015c008;
          }
          if (puVar19 + 1 <= puVar12) goto LAB_0016051c;
          ppvVar11[1] = puVar19 + 2;
          if (*(char *)((long)pvVar8 + (ulong)puVar19[1]) != ':') {
            *(undefined4 *)(ppvVar11 + 4) = 3;
            uVar31 = 0x300000000;
            goto LAB_0015c008;
          }
          *(int *)((long)ppvVar11 + 0x24) = iVar21 + 1;
          if ((*(char *)((long)pvVar8 + uVar31 + 9) == '\"') &&
             (*(long *)((long)pvVar8 + uVar31 + 1) == 0x644974656b72616d)) goto LAB_0015bf3d;
          if (puVar19 + 2 <= puVar12) goto LAB_001604d2;
          iVar26 = *(int *)((long)ppvVar11 + 0x24);
          if (iVar26 < iVar21) goto LAB_001604f1;
          bVar30 = true;
          if (iVar21 < iVar26) {
            ppvVar11[1] = puVar19 + 3;
            bVar29 = *(byte *)((long)pvVar8 + (ulong)puVar19[2]);
            if (bVar29 < 0x5d) {
              if ((bVar29 != 0x2c) && ((bVar29 != 0x3a && (bVar29 != 0x5b)))) {
LAB_0015ba97:
                *(int *)((long)ppvVar11 + 0x24) = iVar26 + -1;
                if (iVar26 + -1 <= iVar21) goto LAB_0015bb0b;
              }
            }
            else if ((bVar29 == 0x7d) || (bVar29 != 0x7b)) goto LAB_0015ba97;
            puVar19 = (uint *)ppvVar11[1];
            while (puVar19 < (uint *)((ulong)*(uint *)(*(long *)((long)ppvVar11[2] + 8) + 8) * 4 +
                                     *(long *)(*(long *)((long)ppvVar11[2] + 8) + 0x10))) {
              ppvVar11[1] = puVar19 + 1;
              bVar29 = *(byte *)((long)pvVar8 + (ulong)*puVar19);
              if (bVar29 < 0x7b) {
                if (bVar29 == 0x5b) {
LAB_0015baf0:
                  *(int *)((long)ppvVar11 + 0x24) = *(int *)((long)ppvVar11 + 0x24) + 1;
                }
                else if (bVar29 == 0x5d) goto LAB_0015baf5;
              }
              else {
                if (bVar29 != 0x7d) {
                  if (bVar29 != 0x7b) goto LAB_0015bb05;
                  goto LAB_0015baf0;
                }
LAB_0015baf5:
                iVar26 = *(int *)((long)ppvVar11 + 0x24) + -1;
                *(int *)((long)ppvVar11 + 0x24) = iVar26;
                if (iVar26 <= iVar21) goto LAB_0015bb0b;
              }
LAB_0015bb05:
              puVar19 = (uint *)ppvVar11[1];
            }
            *(undefined4 *)(ppvVar11 + 4) = 3;
            bVar30 = false;
            uVar31 = 0x300000000;
          }
          else {
LAB_0015bb0b:
            uVar31 = 0;
          }
          bVar25 = false;
          if (!bVar30) goto LAB_0015c017;
          puVar19 = (uint *)ppvVar11[1];
          if (puVar19 <= puVar12) goto LAB_0016051c;
          if (*(int *)((long)ppvVar11 + 0x24) != iVar21) goto LAB_0016053b;
          ppvVar11[1] = puVar19 + 1;
          bVar25 = true;
          if (*(char *)((long)pvVar8 + (ulong)*puVar19) == ',') {
            uVar31 = 1;
          }
          else if (*(char *)((long)pvVar8 + (ulong)*puVar19) == '}') {
            if (0x7ffffffd < uVar16) goto LAB_00160560;
            *(uint *)((long)ppvVar11 + 0x24) = uVar16;
            uVar31 = 0;
          }
          else {
            *(undefined4 *)(ppvVar11 + 4) = 3;
            bVar25 = false;
            uVar31 = 0x300000000;
          }
          if (bVar25) {
            uVar34 = uVar31 & 0xffffffff;
          }
          local_8b4 = (uint)uVar34;
        } while (bVar25);
LAB_0015bff6:
        uVar31 = uVar31 & 0x300000000;
LAB_0015c008:
        bVar25 = false;
        ppvVar11[2] = (void *)0x0;
        *(undefined4 *)((long)ppvVar11 + 0x24) = 0;
      }
      else {
        iVar26 = *(int *)((long)ppvVar11 + 0x24);
        if (iVar21 <= iVar26) {
          bVar36 = true;
          if (iVar21 < iVar26) {
            ppvVar11[1] = puVar20 + 1;
            bVar29 = *(byte *)((long)*ppvVar11 + (ulong)*puVar20);
            if (bVar29 < 0x5d) {
              if ((bVar29 != 0x2c) && ((bVar29 != 0x3a && (bVar29 != 0x5b)))) {
LAB_0015bc47:
                *(int *)((long)ppvVar11 + 0x24) = iVar26 + -1;
                if (iVar26 + -1 <= iVar21) {
LAB_0015bf48:
                  uVar31 = 0;
                  goto LAB_0015bf4b;
                }
              }
            }
            else if ((bVar29 == 0x7d) || (bVar29 != 0x7b)) goto LAB_0015bc47;
            puVar20 = (uint *)ppvVar11[1];
            while (puVar20 < (uint *)((ulong)*(uint *)(*(long *)((long)ppvVar11[2] + 8) + 8) * 4 +
                                     *(long *)(*(long *)((long)ppvVar11[2] + 8) + 0x10))) {
              ppvVar11[1] = puVar20 + 1;
              bVar29 = *(byte *)((long)*ppvVar11 + (ulong)*puVar20);
              if (bVar29 < 0x7b) {
                if (bVar29 == 0x5b) {
LAB_0015bc9b:
                  *(int *)((long)ppvVar11 + 0x24) = *(int *)((long)ppvVar11 + 0x24) + 1;
                }
                else if (bVar29 == 0x5d) goto LAB_0015bca0;
              }
              else {
                if (bVar29 != 0x7d) {
                  if (bVar29 != 0x7b) goto LAB_0015bcb1;
                  goto LAB_0015bc9b;
                }
LAB_0015bca0:
                iVar26 = *(int *)((long)ppvVar11 + 0x24) + -1;
                *(int *)((long)ppvVar11 + 0x24) = iVar26;
                if (iVar26 <= iVar21) goto LAB_0015bf48;
              }
LAB_0015bcb1:
              puVar20 = (uint *)ppvVar11[1];
            }
            *(undefined4 *)(ppvVar11 + 4) = 3;
            bVar36 = false;
            uVar31 = 0x300000000;
          }
          else {
            uVar31 = 0;
          }
LAB_0015bf4b:
          if (bVar36) {
            puVar20 = (uint *)ppvVar11[1];
            if (puVar20 <= puVar12) goto LAB_0016051c;
            if (*(int *)((long)ppvVar11 + 0x24) != iVar21) goto LAB_0016053b;
            if (iVar21 == 0) goto LAB_0016049f;
            ppvVar11[1] = puVar20 + 1;
            bVar36 = true;
            if (*(char *)((long)*ppvVar11 + (ulong)*puVar20) == ',') {
              uVar31 = 1;
            }
            else if (*(char *)((long)*ppvVar11 + (ulong)*puVar20) == '}') {
              if (0x7ffffffd < iVar21 - 1U) goto LAB_00160560;
              *(uint *)((long)ppvVar11 + 0x24) = iVar21 - 1U;
              uVar31 = 0;
            }
            else {
              *(undefined4 *)(ppvVar11 + 4) = 3;
              bVar36 = false;
              uVar31 = 0x300000000;
            }
            uVar34 = (ulong)(local_8b4 & 0xff);
            if (bVar36) {
              uVar34 = uVar31 & 0xffffffff;
            }
            local_8b4 = (uint)uVar34;
            if (bVar36) {
              if (*(uint **)(*(long *)((long)ppvVar11[2] + 0x30) + uVar18 * 8) == puVar12) {
                bVar36 = false;
                goto LAB_0015b96c;
              }
              uVar31 = 0x1900000000;
              bVar25 = false;
              goto LAB_0015c017;
            }
            goto LAB_0015bff6;
          }
          goto LAB_0015c008;
        }
        uVar16 = iVar21 - 1;
        uVar31 = 0x1900000000;
        bVar25 = false;
        if ((int)uVar16 <= iVar26) {
          *(int *)((long)ppvVar11 + 0x24) = iVar21;
          ppvVar11[1] = puVar28;
          if (iVar21 == 0) goto LAB_00160a89;
          *(uint **)(*(long *)((long)ppvVar11[2] + 0x30) + uVar18 * 8) = puVar12;
          bVar36 = true;
          if (*(char *)((long)*ppvVar11 + (ulong)*ppvVar11[1]) == '}') {
            ppvVar11[1] = (uint *)((long)ppvVar11[1] + 4);
            if (0x7ffffffd < uVar16) goto LAB_00160560;
            *(uint *)((long)ppvVar11 + 0x24) = uVar16;
            uVar34 = 0;
          }
          else {
            uVar34 = 1;
          }
          goto LAB_0015b96c;
        }
      }
      goto LAB_0015c017;
    }
    if (pvStack_798 != (void *)0x0) {
      operator_delete__(pvStack_798);
    }
    pvStack_798 = (void *)0x0;
    if (local_7a0 != (void *)0x0) {
      operator_delete__(local_7a0);
    }
    local_7a0 = (void *)0x0;
    if (local_7c0 != (long *)0x0) {
      (**(code **)(*local_7c0 + 0x38))();
    }
    if (local_7f8 != (void *)0x0) {
      operator_delete__(local_7f8);
    }
    Client<hedg::Rest_Client>::~Client((Client<hedg::Rest_Client> *)&e);
    boost::asio::ssl::context::~context(&context);
    for (psVar22 = (service.super_execution_context.service_registry_)->first_service_;
        eVar5.service_registry_ = service.super_execution_context.service_registry_,
        psVar22 != (service *)0x0; psVar22 = psVar22->next_) {
      (*psVar22->_vptr_service[2])(psVar22);
    }
    psVar22 = (service.super_execution_context.service_registry_)->first_service_;
    eVar3.service_registry_ = service.super_execution_context.service_registry_;
    while (service.super_execution_context.service_registry_ = eVar3.service_registry_,
          psVar22 != (service *)0x0) {
      ppp_Var4 = &psVar22->_vptr_service;
      psVar22 = psVar22->next_;
      (*(*ppp_Var4)[1])();
      (eVar5.service_registry_)->first_service_ = psVar22;
      eVar3.service_registry_ = service.super_execution_context.service_registry_;
    }
    if (eVar3.service_registry_ != (service_registry *)0x0) {
      pthread_mutex_destroy((pthread_mutex_t *)&(eVar3.service_registry_)->mutex_);
      operator_delete(eVar3.service_registry_,0x40);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)end_time._M_dataplus._M_p != &end_time.field_2) {
      operator_delete(end_time._M_dataplus._M_p,end_time.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)start_time._M_dataplus._M_p != &start_time.field_2) {
      operator_delete(start_time._M_dataplus._M_p,start_time.field_2._M_allocated_capacity + 1);
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    std::condition_variable::notify_all();
    if (this->time_unit_ == mins) {
      uVar7 = this->time_span_ * 0x3c;
    }
    else if (this->time_unit_ == hours) {
      uVar7 = this->time_span_ * 0xe10;
    }
    else {
      uVar7 = this->time_span_;
    }
    if (0 < (int)uVar7) {
      e._0_8_ = ZEXT48(uVar7);
      e._8_8_ = 0;
      do {
        iVar6 = nanosleep((timespec *)&e,(timespec *)&e);
        if (iVar6 != -1) break;
        piVar13 = __errno_location();
      } while (*piVar13 == 4);
    }
    iVar6 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar6 != 0) goto LAB_0016045c;
  } while( true );
LAB_0015bd26:
  if (local_8b4 == 0) goto LAB_0016061b;
  if (*(int *)((long)ppvVar11 + 0x24) != iVar21) goto LAB_001605dd;
  puVar19 = (uint *)ppvVar11[1];
  if (puVar19 <= puVar12) goto LAB_0016051c;
  ppvVar11[1] = puVar19 + 1;
  uVar34 = (ulong)*puVar19;
  if (*(char *)((long)pvVar8 + uVar34) != '\"') {
    *(undefined4 *)(ppvVar11 + 4) = 3;
    goto LAB_001605fc;
  }
  if (puVar19 + 1 <= puVar12) goto LAB_0016051c;
  ppvVar11[1] = puVar19 + 2;
  if (*(char *)((long)pvVar8 + (ulong)puVar19[1]) != ':') {
    *(undefined4 *)(ppvVar11 + 4) = 3;
    goto LAB_0016063c;
  }
  *(int *)((long)ppvVar11 + 0x24) = iVar21 + 1;
  if ((*(char *)((long)pvVar8 + uVar34 + 9) == '\"') &&
     (*(long *)((long)pvVar8 + uVar34 + 1) == 0x644974656b72616d)) goto LAB_0015bf3d;
  if (puVar19 + 2 <= puVar12) goto LAB_001604d2;
  iVar26 = *(int *)((long)ppvVar11 + 0x24);
  if (iVar26 < iVar21) goto LAB_001604f1;
  bVar36 = true;
  if (iVar21 < iVar26) {
    ppvVar11[1] = puVar19 + 3;
    bVar29 = *(byte *)((long)pvVar8 + (ulong)puVar19[2]);
    if (bVar29 < 0x5d) {
      if ((bVar29 != 0x2c) && ((bVar29 != 0x3a && (bVar29 != 0x5b)))) {
LAB_0015be24:
        *(int *)((long)ppvVar11 + 0x24) = iVar26 + -1;
        if (iVar26 + -1 <= iVar21) goto LAB_0015be98;
      }
    }
    else if ((bVar29 == 0x7d) || (bVar29 != 0x7b)) goto LAB_0015be24;
    puVar19 = (uint *)ppvVar11[1];
    while (puVar19 < (uint *)((ulong)*(uint *)(*(long *)((long)ppvVar11[2] + 8) + 8) * 4 +
                             *(long *)(*(long *)((long)ppvVar11[2] + 8) + 0x10))) {
      ppvVar11[1] = puVar19 + 1;
      bVar29 = *(byte *)((long)pvVar8 + (ulong)*puVar19);
      if (bVar29 < 0x7b) {
        if (bVar29 == 0x5b) {
LAB_0015be7d:
          *(int *)((long)ppvVar11 + 0x24) = *(int *)((long)ppvVar11 + 0x24) + 1;
        }
        else if (bVar29 == 0x5d) goto LAB_0015be82;
      }
      else {
        if (bVar29 != 0x7d) {
          if (bVar29 != 0x7b) goto LAB_0015be92;
          goto LAB_0015be7d;
        }
LAB_0015be82:
        iVar26 = *(int *)((long)ppvVar11 + 0x24) + -1;
        *(int *)((long)ppvVar11 + 0x24) = iVar26;
        if (iVar26 <= iVar21) goto LAB_0015be98;
      }
LAB_0015be92:
      puVar19 = (uint *)ppvVar11[1];
    }
    *(undefined4 *)(ppvVar11 + 4) = 3;
    bVar36 = false;
    uVar31 = 0x300000000;
  }
  else {
LAB_0015be98:
    uVar31 = 0;
  }
  bVar25 = false;
  if (!bVar36) goto LAB_0015c017;
  puVar19 = (uint *)ppvVar11[1];
  if (puVar19 == puVar20) goto LAB_0015bc2d;
  if (puVar19 <= puVar12) goto LAB_0016051c;
  if (*(int *)((long)ppvVar11 + 0x24) != iVar21) goto LAB_0016053b;
  ppvVar11[1] = puVar19 + 1;
  if (*(char *)((long)pvVar8 + (ulong)*puVar19) == ',') {
    bVar36 = true;
    bVar29 = 1;
  }
  else {
    if (*(char *)((long)pvVar8 + (ulong)*puVar19) == '}') {
      if (0x7ffffffd < uVar16) goto LAB_00160560;
      *(uint *)((long)ppvVar11 + 0x24) = uVar16;
      bVar36 = true;
    }
    else {
      *(undefined4 *)(ppvVar11 + 4) = 3;
      bVar36 = false;
    }
    bVar29 = 0;
  }
  local_8b4 = (uint)bVar29;
  if (!bVar36) goto LAB_001606b6;
  goto LAB_0015bd26;
LAB_0015bc2d:
  uVar31 = 0;
  bVar25 = false;
  goto LAB_0015c017;
LAB_0015bf3d:
  uVar31 = 0;
  bVar25 = true;
LAB_0015c017:
  iVar26 = (int)(uVar31 >> 0x20);
  if (uVar31 == 0) {
    if (!bVar25) {
      iVar26 = 0x13;
      goto LAB_0015c06d;
    }
    puVar20 = (uint *)ppvVar11[1];
    if (puVar20 <= puVar12) goto LAB_001609de;
    iVar17 = iVar21 + 1;
    if (*(int *)((long)ppvVar11 + 0x24) != iVar17) goto LAB_001609ff;
    iVar26 = 0;
    ppvVar10 = ppvVar11;
    if (iVar21 == 0) goto LAB_00160a23;
  }
  else {
LAB_0015c06d:
    puVar20 = (uint *)0x0;
    iVar17 = 0;
    ppvVar10 = (void **)0x0;
  }
  if (iVar26 != 0) goto LAB_0015fc54;
  puVar19 = (uint *)ppvVar10[1];
  puVar27 = puVar20;
  if (puVar19 == puVar20) {
    if (*(int *)((long)ppvVar10 + 0x24) != iVar17) goto LAB_001608c5;
    puVar27 = puVar19;
    if (iVar17 == 0) goto LAB_001608ee;
  }
  uVar16 = *puVar27;
  cVar1 = *(char *)((long)*ppvVar10 + (ulong)uVar16);
  if (cVar1 == '\"') {
    if (puVar19 == puVar20) {
      if (*(int *)((long)ppvVar10 + 0x24) != iVar17) goto LAB_001608c5;
      if (iVar17 == 0) goto LAB_001608ee;
      ppvVar10[1] = puVar19 + 1;
      if (iVar17 == 0x7fffffff) goto LAB_00160560;
      *(int *)((long)ppvVar10 + 0x24) = iVar17 + -1;
    }
    pcVar23 = (char *)((long)*ppvVar10 + (ulong)uVar16 + 1);
    iVar26 = 0;
  }
  else {
    iVar26 = 0x10;
    pcVar23 = (char *)0x0;
  }
  if (cVar1 == '\"') {
    puVar19 = (uint *)ppvVar10[3];
    do {
      *(char *)puVar19 = *pcVar23;
      if (*pcVar23 == '\"') {
        bVar36 = false;
        puVar20 = puVar19;
      }
      else {
        if (*pcVar23 == '\\') {
          if ((ulong)(byte)pcVar23[1] == 0x75) {
            uVar16 = *(uint *)(&DAT_00190cd0 + (ulong)(byte)pcVar23[3] * 4) |
                     *(uint *)(&DAT_00191018 + (ulong)(byte)pcVar23[2] * 4) |
                     *(uint *)(&DAT_00190988 + (ulong)(byte)pcVar23[4] * 4) |
                     *(uint *)(&simdjson::internal::digit_to_val32 + (ulong)(byte)pcVar23[5] * 4);
            pcVar24 = pcVar23 + 6;
            if ((uVar16 & 0xfffffc00) == 0xd800) {
              if (((*pcVar24 == '\\') && (pcVar23[7] == 'u')) &&
                 (uVar33 = *(uint *)(&DAT_00190cd0 + (ulong)(byte)pcVar23[9] * 4) |
                           *(uint *)(&DAT_00191018 + (ulong)(byte)pcVar23[8] * 4) |
                           *(uint *)(&DAT_00190988 + (ulong)(byte)pcVar23[10] * 4) |
                           *(uint *)(&simdjson::internal::digit_to_val32 +
                                    (ulong)(byte)pcVar23[0xb] * 4), uVar33 < 0x10000)) {
                uVar16 = (uVar33 - 0xdc00 | uVar16 * 0x400 + 0xfca00000) + 0x10000;
                pcVar24 = pcVar23 + 0xc;
                goto LAB_0015c1e8;
              }
              bVar36 = false;
              pcVar23 = pcVar24;
            }
            else {
LAB_0015c1e8:
              bVar29 = (byte)uVar16;
              if (uVar16 < 0x80) {
                *(byte *)puVar19 = bVar29;
                lVar32 = 1;
LAB_0015c2fd:
                bVar36 = true;
              }
              else {
                if (uVar16 < 0x800) {
                  *(byte *)puVar19 = (byte)(uVar16 >> 6) | 0xc0;
                  *(byte *)((long)puVar19 + 1) = bVar29 & 0x3f | 0x80;
                  lVar32 = 2;
                  goto LAB_0015c2fd;
                }
                if (uVar16 < 0x10000) {
                  *(byte *)puVar19 = (byte)(uVar16 >> 0xc) | 0xe0;
                  *(byte *)((long)puVar19 + 1) = (byte)(uVar16 >> 6) & 0x3f | 0x80;
                  *(byte *)((long)puVar19 + 2) = bVar29 & 0x3f | 0x80;
                  lVar32 = 3;
                  goto LAB_0015c2fd;
                }
                if (uVar16 < 0x110000) {
                  *(byte *)puVar19 = (byte)(uVar16 >> 0x12) | 0xf0;
                  *(byte *)((long)puVar19 + 1) = (byte)(uVar16 >> 0xc) & 0x3f | 0x80;
                  *(byte *)((long)puVar19 + 2) = (byte)(uVar16 >> 6) & 0x3f | 0x80;
                  *(byte *)((long)puVar19 + 3) = bVar29 & 0x3f | 0x80;
                  lVar32 = 4;
                  goto LAB_0015c2fd;
                }
                bVar36 = false;
                lVar32 = 0;
              }
              puVar19 = (uint *)((long)puVar19 + lVar32);
              pcVar23 = pcVar24;
            }
            if (!bVar36) {
              bVar36 = false;
              puVar20 = (uint *)0x0;
              goto LAB_0015c30e;
            }
          }
          else {
            if (simdjson::fallback::(anonymous_namespace)::stringparsing::escape_map
                [(byte)pcVar23[1]] == '\0') {
              bVar36 = false;
              puVar20 = (uint *)0x0;
              goto LAB_0015c30e;
            }
            *(undefined1 *)puVar19 =
                 simdjson::fallback::(anonymous_namespace)::stringparsing::escape_map
                 [(byte)pcVar23[1]];
            pcVar23 = pcVar23 + 2;
            puVar19 = (uint *)((long)puVar19 + 1);
          }
        }
        else {
          pcVar23 = pcVar23 + 1;
          puVar19 = (uint *)((long)puVar19 + 1);
        }
        bVar36 = true;
      }
LAB_0015c30e:
    } while (bVar36);
    if (puVar20 == (uint *)0x0) {
      iVar26 = 5;
      goto LAB_0015c343;
    }
    pvVar8 = ppvVar10[3];
    ppvVar10[3] = puVar20;
    lVar32 = (long)puVar20 - (long)pvVar8;
    iVar26 = 0;
  }
  else {
LAB_0015c343:
    lVar32 = 0;
    pvVar8 = (void *)0x0;
  }
  if (iVar26 != 0) {
LAB_0015fc54:
    puVar14 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar14 = &PTR__exception_001f1e70;
    *(int *)(puVar14 + 1) = iVar26;
    __cxa_throw(puVar14,&simdjson::simdjson_error::typeinfo,std::exception::~exception);
  }
  m_id._M_dataplus._M_p = (pointer)&m_id.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&m_id,pvVar8,lVar32 + (long)pvVar8);
  puVar20 = (uint *)ppvVar11[1];
  if (puVar20 <= puVar12) goto LAB_00160585;
  if (puVar20 == puVar28) {
    uVar34 = 1;
    bVar36 = true;
LAB_0015c406:
    uVar16 = iVar21 - 1;
    do {
      local_8b8 = (uint)uVar34;
      if ((uVar34 & 1) == 0) {
        if (bVar36) goto LAB_0015c6aa;
        *(int *)((long)ppvVar11 + 0x24) = iVar21;
        ppvVar11[1] = puVar28;
        if (iVar21 == 0) goto LAB_00160a89;
        *(uint **)(*(long *)((long)ppvVar11[2] + 0x30) + uVar18 * 8) = puVar12;
        pvVar8 = *ppvVar11;
        local_8b8 = 1;
        if (*(char *)((long)pvVar8 + (ulong)*ppvVar11[1]) != '}') goto LAB_0015c7a3;
        ppvVar11[1] = (uint *)((long)ppvVar11[1] + 4);
        if (0x7ffffffd < uVar16) goto LAB_00160560;
        *(uint *)((long)ppvVar11 + 0x24) = uVar16;
        local_8b8 = 0;
        goto LAB_0015c7a3;
      }
      if (*(int *)((long)ppvVar11 + 0x24) != iVar21) goto LAB_0016047e;
      puVar19 = (uint *)ppvVar11[1];
      if (puVar19 <= puVar12) goto LAB_0016051c;
      if (iVar21 == 0) goto LAB_0016049f;
      pvVar8 = *ppvVar11;
      ppvVar11[1] = puVar19 + 1;
      uVar31 = (ulong)*puVar19;
      if (*(char *)((long)pvVar8 + uVar31) != '\"') {
        *(undefined4 *)(ppvVar11 + 4) = 3;
        uVar31 = 0x300000000;
        goto LAB_0015ca9c;
      }
      if (puVar19 + 1 <= puVar12) goto LAB_0016051c;
      ppvVar11[1] = puVar19 + 2;
      if (*(char *)((long)pvVar8 + (ulong)puVar19[1]) != ':') {
        *(undefined4 *)(ppvVar11 + 4) = 3;
        uVar31 = 0x300000000;
        goto LAB_0015ca9c;
      }
      *(int *)((long)ppvVar11 + 0x24) = iVar21 + 1;
      if ((*(char *)((long)pvVar8 + uVar31 + 0x10) == '\"') &&
         (*(long *)((long)pvVar8 + uVar31 + 8) == 0x656d695474726174 &&
          *(long *)((long)pvVar8 + uVar31 + 1) == 0x745374656b72616d)) goto LAB_0015c9d1;
      if (puVar19 + 2 <= puVar12) goto LAB_001604d2;
      iVar26 = *(int *)((long)ppvVar11 + 0x24);
      if (iVar26 < iVar21) goto LAB_001604f1;
      bVar30 = true;
      if (iVar21 < iVar26) {
        ppvVar11[1] = puVar19 + 3;
        bVar29 = *(byte *)((long)pvVar8 + (ulong)puVar19[2]);
        if (bVar29 < 0x5d) {
          if ((bVar29 != 0x2c) && ((bVar29 != 0x3a && (bVar29 != 0x5b)))) {
LAB_0015c548:
            *(int *)((long)ppvVar11 + 0x24) = iVar26 + -1;
            if (iVar26 + -1 <= iVar21) goto LAB_0015c5bc;
          }
        }
        else if ((bVar29 == 0x7d) || (bVar29 != 0x7b)) goto LAB_0015c548;
        puVar19 = (uint *)ppvVar11[1];
        while (puVar19 < (uint *)((ulong)*(uint *)(*(long *)((long)ppvVar11[2] + 8) + 8) * 4 +
                                 *(long *)(*(long *)((long)ppvVar11[2] + 8) + 0x10))) {
          ppvVar11[1] = puVar19 + 1;
          bVar29 = *(byte *)((long)pvVar8 + (ulong)*puVar19);
          if (bVar29 < 0x7b) {
            if (bVar29 == 0x5b) {
LAB_0015c5a1:
              *(int *)((long)ppvVar11 + 0x24) = *(int *)((long)ppvVar11 + 0x24) + 1;
            }
            else if (bVar29 == 0x5d) goto LAB_0015c5a6;
          }
          else {
            if (bVar29 != 0x7d) {
              if (bVar29 != 0x7b) goto LAB_0015c5b6;
              goto LAB_0015c5a1;
            }
LAB_0015c5a6:
            iVar26 = *(int *)((long)ppvVar11 + 0x24) + -1;
            *(int *)((long)ppvVar11 + 0x24) = iVar26;
            if (iVar26 <= iVar21) goto LAB_0015c5bc;
          }
LAB_0015c5b6:
          puVar19 = (uint *)ppvVar11[1];
        }
        *(undefined4 *)(ppvVar11 + 4) = 3;
        bVar30 = false;
        uVar31 = 0x300000000;
      }
      else {
LAB_0015c5bc:
        uVar31 = 0;
      }
      bVar25 = false;
      if (!bVar30) goto LAB_0015caab;
      puVar19 = (uint *)ppvVar11[1];
      if (puVar19 <= puVar12) goto LAB_0016051c;
      if (*(int *)((long)ppvVar11 + 0x24) != iVar21) goto LAB_0016053b;
      ppvVar11[1] = puVar19 + 1;
      bVar25 = true;
      if (*(char *)((long)pvVar8 + (ulong)*puVar19) == ',') {
        uVar31 = 1;
      }
      else if (*(char *)((long)pvVar8 + (ulong)*puVar19) == '}') {
        if (0x7ffffffd < uVar16) goto LAB_00160560;
        *(uint *)((long)ppvVar11 + 0x24) = uVar16;
        uVar31 = 0;
      }
      else {
        *(undefined4 *)(ppvVar11 + 4) = 3;
        bVar25 = false;
        uVar31 = 0x300000000;
      }
      if (bVar25) {
        uVar34 = uVar31 & 0xffffffff;
      }
      local_8b8 = (uint)uVar34;
    } while (bVar25);
LAB_0015ca8a:
    uVar31 = uVar31 & 0x300000000;
  }
  else {
    iVar26 = *(int *)((long)ppvVar11 + 0x24);
    if (iVar26 < iVar21) {
      uVar16 = iVar21 - 1;
      uVar31 = 0x1900000000;
      bVar25 = false;
      if (iVar26 < (int)uVar16) goto LAB_0015caab;
      *(int *)((long)ppvVar11 + 0x24) = iVar21;
      ppvVar11[1] = puVar28;
      if (iVar21 == 0) goto LAB_00160a89;
      *(uint **)(*(long *)((long)ppvVar11[2] + 0x30) + uVar18 * 8) = puVar12;
      bVar36 = true;
      if (*(char *)((long)*ppvVar11 + (ulong)*ppvVar11[1]) == '}') {
        ppvVar11[1] = (uint *)((long)ppvVar11[1] + 4);
        if (0x7ffffffd < uVar16) goto LAB_00160560;
        *(uint *)((long)ppvVar11 + 0x24) = uVar16;
        uVar34 = 0;
      }
      else {
        uVar34 = 1;
      }
      goto LAB_0015c406;
    }
    bVar36 = true;
    if (iVar21 < iVar26) {
      ppvVar11[1] = puVar20 + 1;
      bVar29 = *(byte *)((long)*ppvVar11 + (ulong)*puVar20);
      if (bVar29 < 0x5d) {
        if ((bVar29 != 0x2c) && ((bVar29 != 0x3a && (bVar29 != 0x5b)))) {
LAB_0015c6c4:
          *(int *)((long)ppvVar11 + 0x24) = iVar26 + -1;
          if (iVar26 + -1 <= iVar21) {
LAB_0015c9dc:
            uVar31 = 0;
            goto LAB_0015c9df;
          }
        }
      }
      else if ((bVar29 == 0x7d) || (bVar29 != 0x7b)) goto LAB_0015c6c4;
      puVar20 = (uint *)ppvVar11[1];
      while (puVar20 < (uint *)((ulong)*(uint *)(*(long *)((long)ppvVar11[2] + 8) + 8) * 4 +
                               *(long *)(*(long *)((long)ppvVar11[2] + 8) + 0x10))) {
        ppvVar11[1] = puVar20 + 1;
        bVar29 = *(byte *)((long)*ppvVar11 + (ulong)*puVar20);
        if (bVar29 < 0x7b) {
          if (bVar29 == 0x5b) {
LAB_0015c718:
            *(int *)((long)ppvVar11 + 0x24) = *(int *)((long)ppvVar11 + 0x24) + 1;
          }
          else if (bVar29 == 0x5d) goto LAB_0015c71d;
        }
        else {
          if (bVar29 != 0x7d) {
            if (bVar29 != 0x7b) goto LAB_0015c72e;
            goto LAB_0015c718;
          }
LAB_0015c71d:
          iVar26 = *(int *)((long)ppvVar11 + 0x24) + -1;
          *(int *)((long)ppvVar11 + 0x24) = iVar26;
          if (iVar26 <= iVar21) goto LAB_0015c9dc;
        }
LAB_0015c72e:
        puVar20 = (uint *)ppvVar11[1];
      }
      *(undefined4 *)(ppvVar11 + 4) = 3;
      bVar36 = false;
      uVar31 = 0x300000000;
    }
    else {
      uVar31 = 0;
    }
LAB_0015c9df:
    if (bVar36) {
      puVar20 = (uint *)ppvVar11[1];
      if (puVar20 <= puVar12) goto LAB_0016051c;
      if (*(int *)((long)ppvVar11 + 0x24) != iVar21) goto LAB_0016053b;
      if (iVar21 == 0) goto LAB_0016049f;
      ppvVar11[1] = puVar20 + 1;
      bVar36 = true;
      if (*(char *)((long)*ppvVar11 + (ulong)*puVar20) == ',') {
        uVar31 = 1;
      }
      else if (*(char *)((long)*ppvVar11 + (ulong)*puVar20) == '}') {
        if (0x7ffffffd < iVar21 - 1U) goto LAB_00160560;
        *(uint *)((long)ppvVar11 + 0x24) = iVar21 - 1U;
        uVar31 = 0;
      }
      else {
        *(undefined4 *)(ppvVar11 + 4) = 3;
        bVar36 = false;
        uVar31 = 0x300000000;
      }
      uVar34 = (ulong)(local_8b8 & 0xff);
      if (bVar36) {
        uVar34 = uVar31 & 0xffffffff;
      }
      local_8b8 = (uint)uVar34;
      if (bVar36) {
        if (*(uint **)(*(long *)((long)ppvVar11[2] + 0x30) + uVar18 * 8) != puVar12) {
          uVar31 = 0x1900000000;
          bVar25 = false;
          goto LAB_0015caab;
        }
        bVar36 = false;
        goto LAB_0015c406;
      }
      goto LAB_0015ca8a;
    }
  }
LAB_0015ca9c:
  bVar25 = false;
  ppvVar11[2] = (void *)0x0;
  *(undefined4 *)((long)ppvVar11 + 0x24) = 0;
  goto LAB_0015caab;
LAB_0015c7a3:
  if (local_8b8 == 0) goto LAB_0016061b;
  if (*(int *)((long)ppvVar11 + 0x24) != iVar21) goto LAB_001605dd;
  puVar19 = (uint *)ppvVar11[1];
  if (puVar19 <= puVar12) goto LAB_0016051c;
  ppvVar11[1] = puVar19 + 1;
  uVar34 = (ulong)*puVar19;
  if (*(char *)((long)pvVar8 + uVar34) != '\"') {
    *(undefined4 *)(ppvVar11 + 4) = 3;
    goto LAB_001605fc;
  }
  if (puVar19 + 1 <= puVar12) goto LAB_0016051c;
  ppvVar11[1] = puVar19 + 2;
  if (*(char *)((long)pvVar8 + (ulong)puVar19[1]) != ':') {
    *(undefined4 *)(ppvVar11 + 4) = 3;
    goto LAB_0016063c;
  }
  *(int *)((long)ppvVar11 + 0x24) = iVar21 + 1;
  if ((*(char *)((long)pvVar8 + uVar34 + 0x10) == '\"') &&
     (*(long *)((long)pvVar8 + uVar34 + 8) == 0x656d695474726174 &&
      *(long *)((long)pvVar8 + uVar34 + 1) == 0x745374656b72616d)) goto LAB_0015c9d1;
  if (puVar19 + 2 <= puVar12) goto LAB_001604d2;
  iVar26 = *(int *)((long)ppvVar11 + 0x24);
  if (iVar26 < iVar21) goto LAB_001604f1;
  bVar36 = true;
  if (iVar21 < iVar26) {
    ppvVar11[1] = puVar19 + 3;
    bVar29 = *(byte *)((long)pvVar8 + (ulong)puVar19[2]);
    if (bVar29 < 0x5d) {
      if ((bVar29 != 0x2c) && ((bVar29 != 0x3a && (bVar29 != 0x5b)))) {
LAB_0015c8b8:
        *(int *)((long)ppvVar11 + 0x24) = iVar26 + -1;
        if (iVar26 + -1 <= iVar21) goto LAB_0015c92c;
      }
    }
    else if ((bVar29 == 0x7d) || (bVar29 != 0x7b)) goto LAB_0015c8b8;
    puVar19 = (uint *)ppvVar11[1];
    while (puVar19 < (uint *)((ulong)*(uint *)(*(long *)((long)ppvVar11[2] + 8) + 8) * 4 +
                             *(long *)(*(long *)((long)ppvVar11[2] + 8) + 0x10))) {
      ppvVar11[1] = puVar19 + 1;
      bVar29 = *(byte *)((long)pvVar8 + (ulong)*puVar19);
      if (bVar29 < 0x7b) {
        if (bVar29 == 0x5b) {
LAB_0015c911:
          *(int *)((long)ppvVar11 + 0x24) = *(int *)((long)ppvVar11 + 0x24) + 1;
        }
        else if (bVar29 == 0x5d) goto LAB_0015c916;
      }
      else {
        if (bVar29 != 0x7d) {
          if (bVar29 != 0x7b) goto LAB_0015c926;
          goto LAB_0015c911;
        }
LAB_0015c916:
        iVar26 = *(int *)((long)ppvVar11 + 0x24) + -1;
        *(int *)((long)ppvVar11 + 0x24) = iVar26;
        if (iVar26 <= iVar21) goto LAB_0015c92c;
      }
LAB_0015c926:
      puVar19 = (uint *)ppvVar11[1];
    }
    *(undefined4 *)(ppvVar11 + 4) = 3;
    bVar36 = false;
    uVar31 = 0x300000000;
  }
  else {
LAB_0015c92c:
    uVar31 = 0;
  }
  bVar25 = false;
  if (!bVar36) goto LAB_0015caab;
  puVar19 = (uint *)ppvVar11[1];
  if (puVar19 == puVar20) goto LAB_0015c6aa;
  if (puVar19 <= puVar12) goto LAB_0016051c;
  if (*(int *)((long)ppvVar11 + 0x24) != iVar21) goto LAB_0016053b;
  ppvVar11[1] = puVar19 + 1;
  if (*(char *)((long)pvVar8 + (ulong)*puVar19) == ',') {
    bVar36 = true;
    bVar29 = 1;
  }
  else {
    if (*(char *)((long)pvVar8 + (ulong)*puVar19) == '}') {
      if (0x7ffffffd < uVar16) goto LAB_00160560;
      *(uint *)((long)ppvVar11 + 0x24) = uVar16;
      bVar36 = true;
    }
    else {
      *(undefined4 *)(ppvVar11 + 4) = 3;
      bVar36 = false;
    }
    bVar29 = 0;
  }
  local_8b8 = (uint)bVar29;
  if (!bVar36) goto LAB_001606b6;
  goto LAB_0015c7a3;
LAB_0015c6aa:
  uVar31 = 0;
  bVar25 = false;
  goto LAB_0015caab;
LAB_0015d22f:
  if (local_8bc == 0) goto LAB_0016061b;
  if (*(int *)((long)ppvVar11 + 0x24) != iVar21) goto LAB_001605dd;
  puVar19 = (uint *)ppvVar11[1];
  if (puVar19 <= puVar12) goto LAB_0016051c;
  ppvVar11[1] = puVar19 + 1;
  uVar34 = (ulong)*puVar19;
  if (*(char *)((long)pvVar8 + uVar34) != '\"') {
    *(undefined4 *)(ppvVar11 + 4) = 3;
    goto LAB_001605fc;
  }
  if (puVar19 + 1 <= puVar12) goto LAB_0016051c;
  ppvVar11[1] = puVar19 + 2;
  if (*(char *)((long)pvVar8 + (ulong)puVar19[1]) != ':') {
    *(undefined4 *)(ppvVar11 + 4) = 3;
    goto LAB_0016063c;
  }
  *(int *)((long)ppvVar11 + 0x24) = iVar21 + 1;
  if ((*(char *)((long)pvVar8 + uVar34 + 10) == '\"') &&
     (*(char *)((long)pvVar8 + uVar34 + 9) == 'e' &&
      *(long *)((long)pvVar8 + uVar34 + 1) == 0x707954746e657665)) goto LAB_0015d454;
  if (puVar19 + 2 <= puVar12) goto LAB_001604d2;
  iVar26 = *(int *)((long)ppvVar11 + 0x24);
  if (iVar26 < iVar21) goto LAB_001604f1;
  bVar36 = true;
  if (iVar21 < iVar26) {
    ppvVar11[1] = puVar19 + 3;
    bVar29 = *(byte *)((long)pvVar8 + (ulong)puVar19[2]);
    if (bVar29 < 0x5d) {
      if ((bVar29 != 0x2c) && ((bVar29 != 0x3a && (bVar29 != 0x5b)))) {
LAB_0015d33b:
        *(int *)((long)ppvVar11 + 0x24) = iVar26 + -1;
        if (iVar26 + -1 <= iVar21) goto LAB_0015d3af;
      }
    }
    else if ((bVar29 == 0x7d) || (bVar29 != 0x7b)) goto LAB_0015d33b;
    puVar19 = (uint *)ppvVar11[1];
    while (puVar19 < (uint *)((ulong)*(uint *)(*(long *)((long)ppvVar11[2] + 8) + 8) * 4 +
                             *(long *)(*(long *)((long)ppvVar11[2] + 8) + 0x10))) {
      ppvVar11[1] = puVar19 + 1;
      bVar29 = *(byte *)((long)pvVar8 + (ulong)*puVar19);
      if (bVar29 < 0x7b) {
        if (bVar29 == 0x5b) {
LAB_0015d394:
          *(int *)((long)ppvVar11 + 0x24) = *(int *)((long)ppvVar11 + 0x24) + 1;
        }
        else if (bVar29 == 0x5d) goto LAB_0015d399;
      }
      else {
        if (bVar29 != 0x7d) {
          if (bVar29 != 0x7b) goto LAB_0015d3a9;
          goto LAB_0015d394;
        }
LAB_0015d399:
        iVar26 = *(int *)((long)ppvVar11 + 0x24) + -1;
        *(int *)((long)ppvVar11 + 0x24) = iVar26;
        if (iVar26 <= iVar21) goto LAB_0015d3af;
      }
LAB_0015d3a9:
      puVar19 = (uint *)ppvVar11[1];
    }
    *(undefined4 *)(ppvVar11 + 4) = 3;
    bVar36 = false;
    uVar31 = 0x300000000;
  }
  else {
LAB_0015d3af:
    uVar31 = 0;
  }
  bVar25 = false;
  if (!bVar36) goto LAB_0015d52e;
  puVar19 = (uint *)ppvVar11[1];
  if (puVar19 == puVar20) goto LAB_0015d136;
  if (puVar19 <= puVar12) goto LAB_0016051c;
  if (*(int *)((long)ppvVar11 + 0x24) != iVar21) goto LAB_0016053b;
  ppvVar11[1] = puVar19 + 1;
  if (*(char *)((long)pvVar8 + (ulong)*puVar19) == ',') {
    bVar36 = true;
    bVar29 = 1;
  }
  else {
    if (*(char *)((long)pvVar8 + (ulong)*puVar19) == '}') {
      if (0x7ffffffd < uVar16) goto LAB_00160560;
      *(uint *)((long)ppvVar11 + 0x24) = uVar16;
      bVar36 = true;
    }
    else {
      *(undefined4 *)(ppvVar11 + 4) = 3;
      bVar36 = false;
    }
    bVar29 = 0;
  }
  local_8bc = (uint)bVar29;
  if (!bVar36) goto LAB_001606b6;
  goto LAB_0015d22f;
LAB_0015d136:
  uVar31 = 0;
  bVar25 = false;
  goto LAB_0015d52e;
LAB_0015d454:
  uVar31 = 0;
  bVar25 = true;
  goto LAB_0015d52e;
LAB_0015f2a3:
  if (!bVar36) goto LAB_0016061b;
  if (*(uint *)((long)ppvVar10 + 0x24) != uVar16) goto LAB_001605dd;
  puVar27 = (uint *)ppvVar10[1];
  if (puVar27 <= puVar20) goto LAB_0016051c;
  ppvVar10[1] = puVar27 + 1;
  uVar34 = (ulong)*puVar27;
  if (*(char *)((long)pvVar8 + uVar34) != '\"') {
    *(undefined4 *)(ppvVar10 + 4) = 3;
    goto LAB_001605fc;
  }
  if (puVar27 + 1 <= puVar20) goto LAB_0016051c;
  ppvVar10[1] = puVar27 + 2;
  cVar1 = *(char *)((long)pvVar8 + (ulong)puVar27[1]);
  if (cVar1 == ':') {
    if (0x7ffffffd < uVar16) goto LAB_001607f1;
    *(uint *)((long)ppvVar10 + 0x24) = uVar16 + 1;
  }
  else {
    *(undefined4 *)(ppvVar10 + 4) = 3;
  }
  if (cVar1 != ':') goto LAB_0016063c;
  if ((*(char *)((long)pvVar8 + uVar34 + 3) == '\"') &&
     (*(short *)((long)pvVar8 + uVar34 + 1) == 0x6469)) goto LAB_0015f4d7;
  if (puVar27 + 2 <= puVar20) goto LAB_001604d2;
  iVar26 = *(int *)((long)ppvVar10 + 0x24);
  if (iVar26 < (int)uVar16) goto LAB_001604f1;
  bVar25 = true;
  if ((int)uVar16 < iVar26) {
    ppvVar10[1] = puVar27 + 3;
    bVar29 = *(byte *)((long)pvVar8 + (ulong)puVar27[2]);
    if (bVar29 < 0x5d) {
      if ((bVar29 != 0x2c) && ((bVar29 != 0x3a && (bVar29 != 0x5b)))) {
LAB_0015f3b3:
        *(int *)((long)ppvVar10 + 0x24) = iVar26 + -1;
        if (iVar26 + -1 <= (int)uVar16) goto LAB_0015f42b;
      }
    }
    else if ((bVar29 == 0x7d) || (bVar29 != 0x7b)) goto LAB_0015f3b3;
    puVar27 = (uint *)ppvVar10[1];
    while (puVar27 < (uint *)((ulong)*(uint *)(*(long *)((long)ppvVar10[2] + 8) + 8) * 4 +
                             *(long *)(*(long *)((long)ppvVar10[2] + 8) + 0x10))) {
      ppvVar10[1] = puVar27 + 1;
      bVar29 = *(byte *)((long)pvVar8 + (ulong)*puVar27);
      if (bVar29 < 0x7b) {
        if (bVar29 == 0x5b) {
LAB_0015f40e:
          *(int *)((long)ppvVar10 + 0x24) = *(int *)((long)ppvVar10 + 0x24) + 1;
        }
        else if (bVar29 == 0x5d) goto LAB_0015f413;
      }
      else {
        if (bVar29 != 0x7d) {
          if (bVar29 != 0x7b) goto LAB_0015f425;
          goto LAB_0015f40e;
        }
LAB_0015f413:
        iVar26 = *(int *)((long)ppvVar10 + 0x24) + -1;
        *(int *)((long)ppvVar10 + 0x24) = iVar26;
        if (iVar26 <= (int)uVar16) goto LAB_0015f42b;
      }
LAB_0015f425:
      puVar27 = (uint *)ppvVar10[1];
    }
    *(undefined4 *)(ppvVar10 + 4) = 3;
    bVar25 = false;
    iVar26 = 3;
  }
  else {
LAB_0015f42b:
    iVar26 = 0;
  }
  bVar36 = false;
  if (!bVar25) goto LAB_0015f86e;
  puVar27 = (uint *)ppvVar10[1];
  if (puVar27 == puVar19) goto LAB_0015f0eb;
  if (puVar27 <= puVar20) goto LAB_0016051c;
  if (*(uint *)((long)ppvVar10 + 0x24) != uVar16) goto LAB_0016053b;
  ppvVar10[1] = puVar27 + 1;
  if (*(char *)((long)pvVar8 + (ulong)*puVar27) == ',') {
    bVar25 = true;
    bVar36 = true;
  }
  else {
    if (*(char *)((long)pvVar8 + (ulong)*puVar27) == '}') {
      if (0x7ffffffd < uVar33) goto LAB_00160560;
      *(uint *)((long)ppvVar10 + 0x24) = uVar33;
      bVar25 = true;
    }
    else {
      *(undefined4 *)(ppvVar10 + 4) = 3;
      bVar25 = false;
    }
    bVar36 = false;
  }
  if (!bVar25) goto LAB_001606b6;
  goto LAB_0015f2a3;
LAB_0015f0eb:
  iVar26 = 0;
  bVar36 = false;
  goto LAB_0015f86e;
LAB_0015f4d7:
  iVar26 = 0;
  bVar36 = true;
  goto LAB_0015f86e;
LAB_0015de80:
  if (local_8c0 == 0) goto LAB_0016061b;
  if (*(int *)((long)ppvVar11 + 0x24) != iVar21) goto LAB_001605dd;
  puVar28 = (uint *)ppvVar11[1];
  if (puVar28 <= puVar12) goto LAB_0016051c;
  ppvVar11[1] = puVar28 + 1;
  uVar18 = (ulong)*puVar28;
  if (*(char *)((long)pvVar8 + uVar18) != '\"') {
    *(undefined4 *)(ppvVar11 + 4) = 3;
    goto LAB_001605fc;
  }
  if (puVar28 + 1 <= puVar12) goto LAB_0016051c;
  ppvVar11[1] = puVar28 + 2;
  if (*(char *)((long)pvVar8 + (ulong)puVar28[1]) != ':') {
    *(undefined4 *)(ppvVar11 + 4) = 3;
    goto LAB_0016063c;
  }
  *(int *)((long)ppvVar11 + 0x24) = iVar21 + 1;
  if ((*(char *)((long)pvVar8 + uVar18 + 6) == '\"') &&
     (*(char *)((long)pvVar8 + uVar18 + 5) == 't' &&
      *(int *)((long)pvVar8 + uVar18 + 1) == 0x6e657665)) goto LAB_0015e094;
  if (puVar28 + 2 <= puVar12) goto LAB_001604d2;
  iVar26 = *(int *)((long)ppvVar11 + 0x24);
  if (iVar26 < iVar21) goto LAB_001604f1;
  bVar36 = true;
  if (iVar21 < iVar26) {
    ppvVar11[1] = puVar28 + 3;
    bVar29 = *(byte *)((long)pvVar8 + (ulong)puVar28[2]);
    if (bVar29 < 0x5d) {
      if ((bVar29 != 0x2c) && ((bVar29 != 0x3a && (bVar29 != 0x5b)))) {
LAB_0015df87:
        *(int *)((long)ppvVar11 + 0x24) = iVar26 + -1;
        if (iVar26 + -1 <= iVar21) goto LAB_0015dffb;
      }
    }
    else if ((bVar29 == 0x7d) || (bVar29 != 0x7b)) goto LAB_0015df87;
    puVar28 = (uint *)ppvVar11[1];
    while (puVar28 < (uint *)((ulong)*(uint *)(*(long *)((long)ppvVar11[2] + 8) + 8) * 4 +
                             *(long *)(*(long *)((long)ppvVar11[2] + 8) + 0x10))) {
      ppvVar11[1] = puVar28 + 1;
      bVar29 = *(byte *)((long)pvVar8 + (ulong)*puVar28);
      if (bVar29 < 0x7b) {
        if (bVar29 == 0x5b) {
LAB_0015dfe0:
          *(int *)((long)ppvVar11 + 0x24) = *(int *)((long)ppvVar11 + 0x24) + 1;
        }
        else if (bVar29 == 0x5d) goto LAB_0015dfe5;
      }
      else {
        if (bVar29 != 0x7d) {
          if (bVar29 != 0x7b) goto LAB_0015dff5;
          goto LAB_0015dfe0;
        }
LAB_0015dfe5:
        iVar26 = *(int *)((long)ppvVar11 + 0x24) + -1;
        *(int *)((long)ppvVar11 + 0x24) = iVar26;
        if (iVar26 <= iVar21) goto LAB_0015dffb;
      }
LAB_0015dff5:
      puVar28 = (uint *)ppvVar11[1];
    }
    *(undefined4 *)(ppvVar11 + 4) = 3;
    bVar36 = false;
    uVar31 = 0x300000000;
  }
  else {
LAB_0015dffb:
    uVar31 = 0;
  }
  bVar25 = false;
  if (!bVar36) goto LAB_0015e3f6;
  puVar28 = (uint *)ppvVar11[1];
  if (puVar28 == puVar20) goto LAB_0015dd93;
  if (puVar28 <= puVar12) goto LAB_0016051c;
  if (*(int *)((long)ppvVar11 + 0x24) != iVar21) goto LAB_0016053b;
  ppvVar11[1] = puVar28 + 1;
  cVar1 = *(char *)((long)pvVar8 + (ulong)*puVar28);
  if (cVar1 == ',') {
    bVar36 = true;
    bVar29 = 1;
  }
  else {
    if (cVar1 != '}') {
      *(undefined4 *)(ppvVar11 + 4) = 3;
    }
    else {
      *(uint *)((long)ppvVar11 + 0x24) = uVar16;
    }
    bVar36 = cVar1 == '}';
    bVar29 = 0;
  }
  local_8c0 = (uint)bVar29;
  if (!bVar36) goto LAB_001606b6;
  goto LAB_0015de80;
LAB_0015dd93:
  uVar31 = 0;
  bVar25 = false;
  goto LAB_0015e3f6;
LAB_0015e094:
  uVar31 = 0;
  bVar25 = true;
  goto LAB_0015e3f6;
LAB_0015f537:
  if (!bVar36) {
LAB_0016061b:
    __assert_fail("has_value",
                  "/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/simdjson/simdjson.h"
                  ,0x6565,
                  "simdjson_result<bool> simdjson::fallback::ondemand::value_iterator::find_field_unordered_raw(const std::string_view)"
                 );
  }
  if (*(uint *)((long)ppvVar11 + 0x24) != uVar16) {
LAB_001605dd:
    __assert_fail("_json_iter->_depth == _depth",
                  "/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/simdjson/simdjson.h"
                  ,0x6566,
                  "simdjson_result<bool> simdjson::fallback::ondemand::value_iterator::find_field_unordered_raw(const std::string_view)"
                 );
  }
  puVar28 = (uint *)ppvVar11[1];
  if (puVar28 <= puVar20) goto LAB_0016051c;
  ppvVar11[1] = puVar28 + 1;
  uVar18 = (ulong)*puVar28;
  if (*(char *)((long)pvVar8 + uVar18) != '\"') {
    *(undefined4 *)(ppvVar11 + 4) = 3;
LAB_001605fc:
    __assert_fail("!error",
                  "/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/simdjson/simdjson.h"
                  ,0x656e,
                  "simdjson_result<bool> simdjson::fallback::ondemand::value_iterator::find_field_unordered_raw(const std::string_view)"
                 );
  }
  if (puVar28 + 1 <= puVar20) goto LAB_0016051c;
  ppvVar11[1] = puVar28 + 2;
  cVar1 = *(char *)((long)pvVar8 + (ulong)puVar28[1]);
  if (cVar1 == ':') {
    if (0x7ffffffd < uVar16) {
LAB_001607f1:
      __assert_fail("child_depth >= 1 && child_depth < (2147483647)",
                    "/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/simdjson/simdjson.h"
                    ,0x63dc,"void simdjson::fallback::ondemand::json_iterator::descend_to(depth_t)")
      ;
    }
    *(uint *)((long)ppvVar11 + 0x24) = uVar16 + 1;
  }
  else {
    *(undefined4 *)(ppvVar11 + 4) = 3;
  }
  if (cVar1 != ':') {
LAB_0016063c:
    __assert_fail("!error",
                  "/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/simdjson/simdjson.h"
                  ,0x6571,
                  "simdjson_result<bool> simdjson::fallback::ondemand::value_iterator::find_field_unordered_raw(const std::string_view)"
                 );
  }
  if ((*(char *)((long)pvVar8 + uVar18 + 0xc) == '\"') &&
     (*(long *)((long)pvVar8 + uVar18 + 4) == 0x65646f437972746e &&
      *(long *)((long)pvVar8 + uVar18 + 1) == 0x437972746e756f63)) goto LAB_0015f78a;
  if (puVar28 + 2 <= puVar20) goto LAB_001604d2;
  iVar21 = *(int *)((long)ppvVar11 + 0x24);
  if (iVar21 < (int)uVar16) goto LAB_001604f1;
  bVar36 = true;
  if ((int)uVar16 < iVar21) {
    ppvVar11[1] = puVar28 + 3;
    bVar29 = *(byte *)((long)pvVar8 + (ulong)puVar28[2]);
    if (bVar29 < 0x5d) {
      if ((bVar29 != 0x2c) && ((bVar29 != 0x3a && (bVar29 != 0x5b)))) {
LAB_0015f666:
        *(int *)((long)ppvVar11 + 0x24) = iVar21 + -1;
        if (iVar21 + -1 <= (int)uVar16) goto LAB_0015f6de;
      }
    }
    else if ((bVar29 == 0x7d) || (bVar29 != 0x7b)) goto LAB_0015f666;
    puVar28 = (uint *)ppvVar11[1];
    while (puVar28 < (uint *)((ulong)*(uint *)(*(long *)((long)ppvVar11[2] + 8) + 8) * 4 +
                             *(long *)(*(long *)((long)ppvVar11[2] + 8) + 0x10))) {
      ppvVar11[1] = puVar28 + 1;
      bVar29 = *(byte *)((long)pvVar8 + (ulong)*puVar28);
      if (bVar29 < 0x7b) {
        if (bVar29 == 0x5b) {
LAB_0015f6c1:
          *(int *)((long)ppvVar11 + 0x24) = *(int *)((long)ppvVar11 + 0x24) + 1;
        }
        else if (bVar29 == 0x5d) goto LAB_0015f6c6;
      }
      else {
        if (bVar29 != 0x7d) {
          if (bVar29 != 0x7b) goto LAB_0015f6d8;
          goto LAB_0015f6c1;
        }
LAB_0015f6c6:
        iVar21 = *(int *)((long)ppvVar11 + 0x24) + -1;
        *(int *)((long)ppvVar11 + 0x24) = iVar21;
        if (iVar21 <= (int)uVar16) goto LAB_0015f6de;
      }
LAB_0015f6d8:
      puVar28 = (uint *)ppvVar11[1];
    }
    *(undefined4 *)(ppvVar11 + 4) = 3;
    bVar36 = false;
    iVar26 = 3;
  }
  else {
LAB_0015f6de:
    iVar26 = 0;
  }
  bVar25 = false;
  if (!bVar36) goto LAB_0015f9b2;
  puVar28 = (uint *)ppvVar11[1];
  if (puVar28 == puVar12) goto LAB_0015f0fc;
  if (puVar28 <= puVar20) goto LAB_0016051c;
  if (*(uint *)((long)ppvVar11 + 0x24) != uVar16) goto LAB_0016053b;
  ppvVar11[1] = puVar28 + 1;
  if (*(char *)((long)pvVar8 + (ulong)*puVar28) == ',') {
    bVar25 = true;
    bVar36 = true;
  }
  else {
    if (*(char *)((long)pvVar8 + (ulong)*puVar28) == '}') {
      if (0x7ffffffd < uVar33) goto LAB_00160560;
      *(uint *)((long)ppvVar11 + 0x24) = uVar33;
      bVar25 = true;
    }
    else {
      *(undefined4 *)(ppvVar11 + 4) = 3;
      bVar25 = false;
    }
    bVar36 = false;
  }
  if (!bVar25) {
LAB_001606b6:
    __assert_fail("!error",
                  "/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/simdjson/simdjson.h"
                  ,0x658d,
                  "simdjson_result<bool> simdjson::fallback::ondemand::value_iterator::find_field_unordered_raw(const std::string_view)"
                 );
  }
  goto LAB_0015f537;
LAB_0015f0fc:
  iVar26 = 0;
  bVar25 = false;
  goto LAB_0015f9b2;
LAB_0015f78a:
  iVar26 = 0;
  bVar25 = true;
  goto LAB_0015f9b2;
LAB_0015fa3c:
  iVar6 = 0;
  goto LAB_0015b76c;
LAB_0015c9d1:
  uVar31 = 0;
  bVar25 = true;
LAB_0015caab:
  iVar26 = (int)(uVar31 >> 0x20);
  if (uVar31 == 0) {
    if (!bVar25) {
      iVar26 = 0x13;
      goto LAB_0015cb01;
    }
    puVar20 = (uint *)ppvVar11[1];
    if (puVar20 <= puVar12) goto LAB_001609de;
    iVar17 = iVar21 + 1;
    if (*(int *)((long)ppvVar11 + 0x24) != iVar17) goto LAB_001609ff;
    iVar26 = 0;
    ppvVar10 = ppvVar11;
    if (iVar21 == 0) goto LAB_00160a23;
  }
  else {
LAB_0015cb01:
    puVar20 = (uint *)0x0;
    iVar17 = 0;
    ppvVar10 = (void **)0x0;
  }
  if (iVar26 != 0) goto LAB_0015fc86;
  puVar19 = (uint *)ppvVar10[1];
  puVar27 = puVar20;
  if (puVar19 == puVar20) {
    if (*(int *)((long)ppvVar10 + 0x24) != iVar17) goto LAB_001608c5;
    puVar27 = puVar19;
    if (iVar17 == 0) goto LAB_001608ee;
  }
  uVar16 = *puVar27;
  cVar1 = *(char *)((long)*ppvVar10 + (ulong)uVar16);
  if (cVar1 == '\"') {
    if (puVar19 == puVar20) {
      if (*(int *)((long)ppvVar10 + 0x24) != iVar17) goto LAB_001608c5;
      if (iVar17 == 0) goto LAB_001608ee;
      ppvVar10[1] = puVar19 + 1;
      if (iVar17 == 0x7fffffff) goto LAB_00160560;
      *(int *)((long)ppvVar10 + 0x24) = iVar17 + -1;
    }
    pcVar23 = (char *)((long)*ppvVar10 + (ulong)uVar16 + 1);
    iVar26 = 0;
  }
  else {
    iVar26 = 0x10;
    pcVar23 = (char *)0x0;
  }
  if (cVar1 == '\"') {
    puVar19 = (uint *)ppvVar10[3];
    do {
      *(char *)puVar19 = *pcVar23;
      if (*pcVar23 == '\"') {
        bVar36 = false;
        puVar20 = puVar19;
      }
      else {
        if (*pcVar23 == '\\') {
          if ((ulong)(byte)pcVar23[1] == 0x75) {
            uVar16 = *(uint *)(&DAT_00190cd0 + (ulong)(byte)pcVar23[3] * 4) |
                     *(uint *)(&DAT_00191018 + (ulong)(byte)pcVar23[2] * 4) |
                     *(uint *)(&DAT_00190988 + (ulong)(byte)pcVar23[4] * 4) |
                     *(uint *)(&simdjson::internal::digit_to_val32 + (ulong)(byte)pcVar23[5] * 4);
            pcVar24 = pcVar23 + 6;
            if ((uVar16 & 0xfffffc00) == 0xd800) {
              if (((*pcVar24 == '\\') && (pcVar23[7] == 'u')) &&
                 (uVar33 = *(uint *)(&DAT_00190cd0 + (ulong)(byte)pcVar23[9] * 4) |
                           *(uint *)(&DAT_00191018 + (ulong)(byte)pcVar23[8] * 4) |
                           *(uint *)(&DAT_00190988 + (ulong)(byte)pcVar23[10] * 4) |
                           *(uint *)(&simdjson::internal::digit_to_val32 +
                                    (ulong)(byte)pcVar23[0xb] * 4), uVar33 < 0x10000)) {
                uVar16 = (uVar33 - 0xdc00 | uVar16 * 0x400 + 0xfca00000) + 0x10000;
                pcVar24 = pcVar23 + 0xc;
                goto LAB_0015cc7c;
              }
              bVar36 = false;
              pcVar23 = pcVar24;
            }
            else {
LAB_0015cc7c:
              bVar29 = (byte)uVar16;
              if (uVar16 < 0x80) {
                *(byte *)puVar19 = bVar29;
                lVar32 = 1;
LAB_0015cd91:
                bVar36 = true;
              }
              else {
                if (uVar16 < 0x800) {
                  *(byte *)puVar19 = (byte)(uVar16 >> 6) | 0xc0;
                  *(byte *)((long)puVar19 + 1) = bVar29 & 0x3f | 0x80;
                  lVar32 = 2;
                  goto LAB_0015cd91;
                }
                if (uVar16 < 0x10000) {
                  *(byte *)puVar19 = (byte)(uVar16 >> 0xc) | 0xe0;
                  *(byte *)((long)puVar19 + 1) = (byte)(uVar16 >> 6) & 0x3f | 0x80;
                  *(byte *)((long)puVar19 + 2) = bVar29 & 0x3f | 0x80;
                  lVar32 = 3;
                  goto LAB_0015cd91;
                }
                if (uVar16 < 0x110000) {
                  *(byte *)puVar19 = (byte)(uVar16 >> 0x12) | 0xf0;
                  *(byte *)((long)puVar19 + 1) = (byte)(uVar16 >> 0xc) & 0x3f | 0x80;
                  *(byte *)((long)puVar19 + 2) = (byte)(uVar16 >> 6) & 0x3f | 0x80;
                  *(byte *)((long)puVar19 + 3) = bVar29 & 0x3f | 0x80;
                  lVar32 = 4;
                  goto LAB_0015cd91;
                }
                bVar36 = false;
                lVar32 = 0;
              }
              puVar19 = (uint *)((long)puVar19 + lVar32);
              pcVar23 = pcVar24;
            }
            if (!bVar36) {
              bVar36 = false;
              puVar20 = (uint *)0x0;
              goto LAB_0015cda2;
            }
          }
          else {
            if (simdjson::fallback::(anonymous_namespace)::stringparsing::escape_map
                [(byte)pcVar23[1]] == '\0') {
              bVar36 = false;
              puVar20 = (uint *)0x0;
              goto LAB_0015cda2;
            }
            *(undefined1 *)puVar19 =
                 simdjson::fallback::(anonymous_namespace)::stringparsing::escape_map
                 [(byte)pcVar23[1]];
            pcVar23 = pcVar23 + 2;
            puVar19 = (uint *)((long)puVar19 + 1);
          }
        }
        else {
          pcVar23 = pcVar23 + 1;
          puVar19 = (uint *)((long)puVar19 + 1);
        }
        bVar36 = true;
      }
LAB_0015cda2:
    } while (bVar36);
    if (puVar20 == (uint *)0x0) {
      iVar26 = 5;
      goto LAB_0015cdd7;
    }
    pvVar8 = ppvVar10[3];
    ppvVar10[3] = puVar20;
    lVar32 = (long)puVar20 - (long)pvVar8;
    iVar26 = 0;
  }
  else {
LAB_0015cdd7:
    lVar32 = 0;
    pvVar8 = (void *)0x0;
  }
  if (iVar26 != 0) {
LAB_0015fc86:
    puVar14 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar14 = &PTR__exception_001f1e70;
    *(int *)(puVar14 + 1) = iVar26;
    __cxa_throw(puVar14,&simdjson::simdjson_error::typeinfo,std::exception::~exception);
  }
  m_tm._M_dataplus._M_p = (pointer)&m_tm.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&m_tm,pvVar8,lVar32 + (long)pvVar8);
  puVar20 = (uint *)ppvVar11[1];
  if (puVar20 <= puVar12) goto LAB_00160585;
  if (puVar20 == puVar28) {
    uVar34 = 1;
    bVar36 = true;
LAB_0015ce9a:
    uVar16 = iVar21 - 1;
    do {
      local_8bc = (uint)uVar34;
      if ((uVar34 & 1) == 0) {
        if (bVar36) goto LAB_0015d136;
        *(int *)((long)ppvVar11 + 0x24) = iVar21;
        ppvVar11[1] = puVar28;
        if (iVar21 == 0) goto LAB_00160a89;
        *(uint **)(*(long *)((long)ppvVar11[2] + 0x30) + uVar18 * 8) = puVar12;
        pvVar8 = *ppvVar11;
        local_8bc = 1;
        if (*(char *)((long)pvVar8 + (ulong)*ppvVar11[1]) != '}') goto LAB_0015d22f;
        ppvVar11[1] = (uint *)((long)ppvVar11[1] + 4);
        if (0x7ffffffd < uVar16) goto LAB_00160560;
        *(uint *)((long)ppvVar11 + 0x24) = uVar16;
        local_8bc = 0;
        goto LAB_0015d22f;
      }
      if (*(int *)((long)ppvVar11 + 0x24) != iVar21) goto LAB_0016047e;
      puVar19 = (uint *)ppvVar11[1];
      if (puVar19 <= puVar12) goto LAB_0016051c;
      if (iVar21 == 0) goto LAB_0016049f;
      pvVar8 = *ppvVar11;
      ppvVar11[1] = puVar19 + 1;
      uVar31 = (ulong)*puVar19;
      if (*(char *)((long)pvVar8 + uVar31) != '\"') {
        *(undefined4 *)(ppvVar11 + 4) = 3;
        uVar31 = 0x300000000;
        goto LAB_0015d51f;
      }
      if (puVar19 + 1 <= puVar12) goto LAB_0016051c;
      ppvVar11[1] = puVar19 + 2;
      if (*(char *)((long)pvVar8 + (ulong)puVar19[1]) != ':') {
        *(undefined4 *)(ppvVar11 + 4) = 3;
        uVar31 = 0x300000000;
        goto LAB_0015d51f;
      }
      *(int *)((long)ppvVar11 + 0x24) = iVar21 + 1;
      if ((*(char *)((long)pvVar8 + uVar31 + 10) == '\"') &&
         (*(char *)((long)pvVar8 + uVar31 + 9) == 'e' &&
          *(long *)((long)pvVar8 + uVar31 + 1) == 0x707954746e657665)) goto LAB_0015d454;
      if (puVar19 + 2 <= puVar12) goto LAB_001604d2;
      iVar26 = *(int *)((long)ppvVar11 + 0x24);
      if (iVar26 < iVar21) goto LAB_001604f1;
      bVar30 = true;
      if (iVar21 < iVar26) {
        ppvVar11[1] = puVar19 + 3;
        bVar29 = *(byte *)((long)pvVar8 + (ulong)puVar19[2]);
        if (bVar29 < 0x5d) {
          if ((bVar29 != 0x2c) && ((bVar29 != 0x3a && (bVar29 != 0x5b)))) {
LAB_0015cfd4:
            *(int *)((long)ppvVar11 + 0x24) = iVar26 + -1;
            if (iVar26 + -1 <= iVar21) goto LAB_0015d048;
          }
        }
        else if ((bVar29 == 0x7d) || (bVar29 != 0x7b)) goto LAB_0015cfd4;
        puVar19 = (uint *)ppvVar11[1];
        while (puVar19 < (uint *)((ulong)*(uint *)(*(long *)((long)ppvVar11[2] + 8) + 8) * 4 +
                                 *(long *)(*(long *)((long)ppvVar11[2] + 8) + 0x10))) {
          ppvVar11[1] = puVar19 + 1;
          bVar29 = *(byte *)((long)pvVar8 + (ulong)*puVar19);
          if (bVar29 < 0x7b) {
            if (bVar29 == 0x5b) {
LAB_0015d02d:
              *(int *)((long)ppvVar11 + 0x24) = *(int *)((long)ppvVar11 + 0x24) + 1;
            }
            else if (bVar29 == 0x5d) goto LAB_0015d032;
          }
          else {
            if (bVar29 != 0x7d) {
              if (bVar29 != 0x7b) goto LAB_0015d042;
              goto LAB_0015d02d;
            }
LAB_0015d032:
            iVar26 = *(int *)((long)ppvVar11 + 0x24) + -1;
            *(int *)((long)ppvVar11 + 0x24) = iVar26;
            if (iVar26 <= iVar21) goto LAB_0015d048;
          }
LAB_0015d042:
          puVar19 = (uint *)ppvVar11[1];
        }
        *(undefined4 *)(ppvVar11 + 4) = 3;
        bVar30 = false;
        uVar31 = 0x300000000;
      }
      else {
LAB_0015d048:
        uVar31 = 0;
      }
      bVar25 = false;
      if (!bVar30) goto LAB_0015d52e;
      puVar19 = (uint *)ppvVar11[1];
      if (puVar19 <= puVar12) goto LAB_0016051c;
      if (*(int *)((long)ppvVar11 + 0x24) != iVar21) goto LAB_0016053b;
      ppvVar11[1] = puVar19 + 1;
      bVar25 = true;
      if (*(char *)((long)pvVar8 + (ulong)*puVar19) == ',') {
        uVar31 = 1;
      }
      else if (*(char *)((long)pvVar8 + (ulong)*puVar19) == '}') {
        if (0x7ffffffd < uVar16) goto LAB_00160560;
        *(uint *)((long)ppvVar11 + 0x24) = uVar16;
        uVar31 = 0;
      }
      else {
        *(undefined4 *)(ppvVar11 + 4) = 3;
        bVar25 = false;
        uVar31 = 0x300000000;
      }
      if (bVar25) {
        uVar34 = uVar31 & 0xffffffff;
      }
      local_8bc = (uint)uVar34;
    } while (bVar25);
LAB_0015d50d:
    uVar31 = uVar31 & 0x300000000;
LAB_0015d51f:
    bVar25 = false;
    ppvVar11[2] = (void *)0x0;
    *(undefined4 *)((long)ppvVar11 + 0x24) = 0;
  }
  else {
    iVar26 = *(int *)((long)ppvVar11 + 0x24);
    if (iVar21 <= iVar26) {
      bVar36 = true;
      if (iVar21 < iVar26) {
        ppvVar11[1] = puVar20 + 1;
        bVar29 = *(byte *)((long)*ppvVar11 + (ulong)*puVar20);
        if (bVar29 < 0x5d) {
          if ((bVar29 != 0x2c) && ((bVar29 != 0x3a && (bVar29 != 0x5b)))) {
LAB_0015d150:
            *(int *)((long)ppvVar11 + 0x24) = iVar26 + -1;
            if (iVar26 + -1 <= iVar21) {
LAB_0015d45f:
              uVar31 = 0;
              goto LAB_0015d462;
            }
          }
        }
        else if ((bVar29 == 0x7d) || (bVar29 != 0x7b)) goto LAB_0015d150;
        puVar20 = (uint *)ppvVar11[1];
        while (puVar20 < (uint *)((ulong)*(uint *)(*(long *)((long)ppvVar11[2] + 8) + 8) * 4 +
                                 *(long *)(*(long *)((long)ppvVar11[2] + 8) + 0x10))) {
          ppvVar11[1] = puVar20 + 1;
          bVar29 = *(byte *)((long)*ppvVar11 + (ulong)*puVar20);
          if (bVar29 < 0x7b) {
            if (bVar29 == 0x5b) {
LAB_0015d1a4:
              *(int *)((long)ppvVar11 + 0x24) = *(int *)((long)ppvVar11 + 0x24) + 1;
            }
            else if (bVar29 == 0x5d) goto LAB_0015d1a9;
          }
          else {
            if (bVar29 != 0x7d) {
              if (bVar29 != 0x7b) goto LAB_0015d1ba;
              goto LAB_0015d1a4;
            }
LAB_0015d1a9:
            iVar26 = *(int *)((long)ppvVar11 + 0x24) + -1;
            *(int *)((long)ppvVar11 + 0x24) = iVar26;
            if (iVar26 <= iVar21) goto LAB_0015d45f;
          }
LAB_0015d1ba:
          puVar20 = (uint *)ppvVar11[1];
        }
        *(undefined4 *)(ppvVar11 + 4) = 3;
        bVar36 = false;
        uVar31 = 0x300000000;
      }
      else {
        uVar31 = 0;
      }
LAB_0015d462:
      if (bVar36) {
        puVar20 = (uint *)ppvVar11[1];
        if (puVar20 <= puVar12) goto LAB_0016051c;
        if (*(int *)((long)ppvVar11 + 0x24) != iVar21) goto LAB_0016053b;
        if (iVar21 == 0) goto LAB_0016049f;
        ppvVar11[1] = puVar20 + 1;
        bVar36 = true;
        if (*(char *)((long)*ppvVar11 + (ulong)*puVar20) == ',') {
          uVar31 = 1;
        }
        else if (*(char *)((long)*ppvVar11 + (ulong)*puVar20) == '}') {
          if (0x7ffffffd < iVar21 - 1U) goto LAB_00160560;
          *(uint *)((long)ppvVar11 + 0x24) = iVar21 - 1U;
          uVar31 = 0;
        }
        else {
          *(undefined4 *)(ppvVar11 + 4) = 3;
          bVar36 = false;
          uVar31 = 0x300000000;
        }
        uVar34 = (ulong)(local_8bc & 0xff);
        if (bVar36) {
          uVar34 = uVar31 & 0xffffffff;
        }
        local_8bc = (uint)uVar34;
        if (bVar36) {
          if (*(uint **)(*(long *)((long)ppvVar11[2] + 0x30) + uVar18 * 8) == puVar12) {
            bVar36 = false;
            goto LAB_0015ce9a;
          }
          uVar31 = 0x1900000000;
          bVar25 = false;
          goto LAB_0015d52e;
        }
        goto LAB_0015d50d;
      }
      goto LAB_0015d51f;
    }
    uVar16 = iVar21 - 1;
    uVar31 = 0x1900000000;
    bVar25 = false;
    if ((int)uVar16 <= iVar26) {
      *(int *)((long)ppvVar11 + 0x24) = iVar21;
      ppvVar11[1] = puVar28;
      if (iVar21 == 0) goto LAB_00160a89;
      *(uint **)(*(long *)((long)ppvVar11[2] + 0x30) + uVar18 * 8) = puVar12;
      bVar36 = true;
      if (*(char *)((long)*ppvVar11 + (ulong)*ppvVar11[1]) == '}') {
        ppvVar11[1] = (uint *)((long)ppvVar11[1] + 4);
        if (0x7ffffffd < uVar16) goto LAB_00160560;
        *(uint *)((long)ppvVar11 + 0x24) = uVar16;
        uVar34 = 0;
      }
      else {
        uVar34 = 1;
      }
      goto LAB_0015ce9a;
    }
  }
LAB_0015d52e:
  iVar26 = (int)(uVar31 >> 0x20);
  if (uVar31 == 0) {
    if (bVar25) {
      puVar20 = (uint *)ppvVar11[1];
      if (puVar20 <= puVar12) goto LAB_001609de;
      uVar34 = (ulong)(iVar21 + 1U);
      if (*(uint *)((long)ppvVar11 + 0x24) != iVar21 + 1U) goto LAB_001609ff;
      iVar26 = 0;
      ppvVar10 = ppvVar11;
      if (iVar21 == 0) goto LAB_00160a23;
    }
    else {
      puVar20 = (uint *)0x0;
      iVar26 = 0x13;
      uVar34 = 0;
      ppvVar10 = (void **)0x0;
    }
  }
  else {
    puVar20 = (uint *)0x0;
    uVar34 = 0;
    ppvVar10 = (void **)0x0;
  }
  if (iVar26 == 0) {
    puVar19 = (uint *)ppvVar10[1];
    if (puVar19 == puVar20) {
      iVar17 = (int)uVar34;
      if (*(int *)((long)ppvVar10 + 0x24) != iVar17) goto LAB_001608c5;
      if (iVar17 == 0) goto LAB_001608ee;
      iVar26 = 0x10;
      if (*(char *)((long)*ppvVar10 + (ulong)*puVar19) == '{') {
        ppvVar10[1] = puVar19 + 1;
        if ((uint *)ppvVar10[1] != puVar20 + 1) goto LAB_00160767;
        if (*(int *)((long)ppvVar10 + 0x24) != iVar17) goto LAB_0016072f;
        *(uint **)(*(long *)((long)ppvVar10[2] + 0x30) + uVar34 * 8) = puVar20;
        if (*(char *)((long)*ppvVar10 + (ulong)*ppvVar10[1]) == '}') {
          ppvVar10[1] = (uint *)((long)ppvVar10[1] + 4);
          if (iVar17 == 0x7fffffff) goto LAB_00160560;
          *(int *)((long)ppvVar10 + 0x24) = iVar17 + -1;
        }
        iVar26 = 0;
      }
      if (iVar26 == 0) goto LAB_0015d5ab;
      ppvVar10 = (void **)0x0;
      uVar34 = 0;
      puVar20 = (uint *)0x0;
    }
    else {
LAB_0015d5ab:
      iVar26 = 0;
    }
    if (iVar26 != 0) goto LAB_0015d6ad;
    puVar19 = (uint *)ppvVar10[1];
    if (puVar19 <= puVar20) goto LAB_00160585;
    puVar27 = puVar20 + 1;
    uVar16 = (uint)uVar34;
    if (puVar19 == puVar27) {
      bVar36 = true;
      bVar25 = true;
LAB_0015e0ab:
      uVar33 = uVar16 - 1;
      do {
        if (!bVar36) {
          if (bVar25) goto LAB_0015f0eb;
          *(uint *)((long)ppvVar10 + 0x24) = uVar16;
          ppvVar10[1] = puVar27;
          if (uVar16 == 0) goto LAB_00160a89;
          *(uint **)(*(long *)((long)ppvVar10[2] + 0x30) + uVar34 * 8) = puVar20;
          pvVar8 = *ppvVar10;
          bVar36 = true;
          if (*(char *)((long)pvVar8 + (ulong)*ppvVar10[1]) != '}') goto LAB_0015f2a3;
          ppvVar10[1] = (uint *)((long)ppvVar10[1] + 4);
          if (0x7ffffffd < uVar33) goto LAB_00160560;
          *(uint *)((long)ppvVar10 + 0x24) = uVar33;
          bVar36 = false;
          goto LAB_0015f2a3;
        }
        if (*(uint *)((long)ppvVar10 + 0x24) != uVar16) goto LAB_0016047e;
        puVar35 = (uint *)ppvVar10[1];
        if (puVar35 <= puVar20) goto LAB_0016051c;
        if (uVar16 == 0) goto LAB_0016049f;
        pvVar8 = *ppvVar10;
        ppvVar10[1] = puVar35 + 1;
        uVar31 = (ulong)*puVar35;
        if (*(char *)((long)pvVar8 + uVar31) != '\"') {
          *(undefined4 *)(ppvVar10 + 4) = 3;
          iVar26 = 3;
          break;
        }
        if (puVar35 + 1 <= puVar20) goto LAB_0016051c;
        ppvVar10[1] = puVar35 + 2;
        cVar1 = *(char *)((long)pvVar8 + (ulong)puVar35[1]);
        if (cVar1 == ':') {
          if (0x7ffffffd < uVar16) goto LAB_001607f1;
          *(uint *)((long)ppvVar10 + 0x24) = uVar16 + 1;
          iVar26 = 0;
        }
        else {
          *(undefined4 *)(ppvVar10 + 4) = 3;
          iVar26 = 3;
        }
        if (cVar1 != ':') break;
        if ((*(char *)((long)pvVar8 + uVar31 + 3) == '\"') &&
           (*(short *)((long)pvVar8 + uVar31 + 1) == 0x6469)) goto LAB_0015f4d7;
        if (puVar35 + 2 <= puVar20) goto LAB_001604d2;
        iVar26 = *(int *)((long)ppvVar10 + 0x24);
        if (iVar26 < (int)uVar16) goto LAB_001604f1;
        bVar30 = true;
        if ((int)uVar16 < iVar26) {
          ppvVar10[1] = puVar35 + 3;
          bVar29 = *(byte *)((long)pvVar8 + (ulong)puVar35[2]);
          if (bVar29 < 0x5d) {
            if ((bVar29 != 0x2c) && ((bVar29 != 0x3a && (bVar29 != 0x5b)))) {
LAB_0015e203:
              *(int *)((long)ppvVar10 + 0x24) = iVar26 + -1;
              if (iVar26 + -1 <= (int)uVar16) goto LAB_0015e278;
            }
          }
          else if ((bVar29 == 0x7d) || (bVar29 != 0x7b)) goto LAB_0015e203;
          puVar35 = (uint *)ppvVar10[1];
          while (puVar35 < (uint *)((ulong)*(uint *)(*(long *)((long)ppvVar10[2] + 8) + 8) * 4 +
                                   *(long *)(*(long *)((long)ppvVar10[2] + 8) + 0x10))) {
            ppvVar10[1] = puVar35 + 1;
            bVar29 = *(byte *)((long)pvVar8 + (ulong)*puVar35);
            if (bVar29 < 0x7b) {
              if (bVar29 == 0x5b) {
LAB_0015e25f:
                *(int *)((long)ppvVar10 + 0x24) = *(int *)((long)ppvVar10 + 0x24) + 1;
              }
              else if (bVar29 == 0x5d) goto LAB_0015e264;
            }
            else {
              if (bVar29 != 0x7d) {
                if (bVar29 != 0x7b) goto LAB_0015e272;
                goto LAB_0015e25f;
              }
LAB_0015e264:
              iVar26 = *(int *)((long)ppvVar10 + 0x24) + -1;
              *(int *)((long)ppvVar10 + 0x24) = iVar26;
              if (iVar26 <= (int)uVar16) goto LAB_0015e278;
            }
LAB_0015e272:
            puVar35 = (uint *)ppvVar10[1];
          }
          *(undefined4 *)(ppvVar10 + 4) = 3;
          bVar30 = false;
          iVar26 = 3;
        }
        else {
LAB_0015e278:
          iVar26 = 0;
        }
        bVar36 = false;
        if (!bVar30) goto LAB_0015f86e;
        puVar35 = (uint *)ppvVar10[1];
        if (puVar35 <= puVar20) goto LAB_0016051c;
        if (*(uint *)((long)ppvVar10 + 0x24) != uVar16) goto LAB_0016053b;
        ppvVar10[1] = puVar35 + 1;
        bVar30 = true;
        if (*(char *)((long)pvVar8 + (ulong)*puVar35) == ',') {
          iVar26 = 0;
          bVar36 = true;
        }
        else if (*(char *)((long)pvVar8 + (ulong)*puVar35) == '}') {
          if (0x7ffffffd < uVar33) goto LAB_00160560;
          *(uint *)((long)ppvVar10 + 0x24) = uVar33;
          iVar26 = 0;
          bVar36 = false;
        }
        else {
          *(undefined4 *)(ppvVar10 + 4) = 3;
          bVar30 = false;
          iVar26 = 3;
          bVar36 = false;
        }
      } while (bVar30);
LAB_0015f85f:
      bVar36 = false;
      ppvVar10[2] = (void *)0x0;
      *(undefined4 *)((long)ppvVar10 + 0x24) = 0;
    }
    else {
      iVar17 = *(int *)((long)ppvVar10 + 0x24);
      if ((int)uVar16 <= iVar17) {
        bVar36 = true;
        if ((int)uVar16 < iVar17) {
          ppvVar10[1] = puVar19 + 1;
          bVar29 = *(byte *)((long)*ppvVar10 + (ulong)*puVar19);
          if (bVar29 < 0x5d) {
            if ((bVar29 != 0x2c) && ((bVar29 != 0x3a && (bVar29 != 0x5b)))) {
LAB_0015f111:
              *(int *)((long)ppvVar10 + 0x24) = iVar17 + -1;
              if (iVar17 + -1 <= (int)uVar16) {
LAB_0015f795:
                iVar26 = 0;
                goto LAB_0015f79d;
              }
            }
          }
          else if ((bVar29 == 0x7d) || (bVar29 != 0x7b)) goto LAB_0015f111;
          puVar19 = (uint *)ppvVar10[1];
          while (puVar19 < (uint *)((ulong)*(uint *)(*(long *)((long)ppvVar10[2] + 8) + 8) * 4 +
                                   *(long *)(*(long *)((long)ppvVar10[2] + 8) + 0x10))) {
            ppvVar10[1] = puVar19 + 1;
            bVar29 = *(byte *)((long)*ppvVar10 + (ulong)*puVar19);
            if (bVar29 < 0x7b) {
              if (bVar29 == 0x5b) {
LAB_0015f166:
                *(int *)((long)ppvVar10 + 0x24) = *(int *)((long)ppvVar10 + 0x24) + 1;
              }
              else if (bVar29 == 0x5d) goto LAB_0015f16b;
            }
            else {
              if (bVar29 != 0x7d) {
                if (bVar29 != 0x7b) goto LAB_0015f17d;
                goto LAB_0015f166;
              }
LAB_0015f16b:
              iVar26 = *(int *)((long)ppvVar10 + 0x24) + -1;
              *(int *)((long)ppvVar10 + 0x24) = iVar26;
              if (iVar26 <= (int)uVar16) goto LAB_0015f795;
            }
LAB_0015f17d:
            puVar19 = (uint *)ppvVar10[1];
          }
          *(undefined4 *)(ppvVar10 + 4) = 3;
          bVar36 = false;
          iVar26 = 3;
        }
        else {
          iVar26 = 0;
        }
LAB_0015f79d:
        if (bVar36) {
          puVar19 = (uint *)ppvVar10[1];
          if (puVar19 <= puVar20) goto LAB_0016051c;
          if (*(uint *)((long)ppvVar10 + 0x24) != uVar16) goto LAB_0016053b;
          if (uVar16 == 0) goto LAB_0016049f;
          ppvVar10[1] = puVar19 + 1;
          bVar25 = true;
          if (*(char *)((long)*ppvVar10 + (ulong)*puVar19) == ',') {
            iVar26 = 0;
            bVar36 = true;
          }
          else if (*(char *)((long)*ppvVar10 + (ulong)*puVar19) == '}') {
            if (uVar16 == 0x7fffffff) goto LAB_00160560;
            *(uint *)((long)ppvVar10 + 0x24) = uVar16 - 1;
            iVar26 = 0;
            bVar36 = false;
          }
          else {
            *(undefined4 *)(ppvVar10 + 4) = 3;
            bVar25 = false;
            iVar26 = 3;
            bVar36 = false;
          }
          if (bVar25) {
            if (*(uint **)(*(long *)((long)ppvVar10[2] + 0x30) + uVar34 * 8) == puVar20) {
              bVar25 = false;
              goto LAB_0015e0ab;
            }
            iVar26 = 0x19;
            bVar36 = false;
            goto LAB_0015f86e;
          }
        }
        goto LAB_0015f85f;
      }
      iVar26 = 0x19;
      bVar36 = false;
      if ((int)(uVar16 - 1) <= iVar17) {
        *(uint *)((long)ppvVar10 + 0x24) = uVar16;
        ppvVar10[1] = puVar27;
        if (uVar16 == 0) goto LAB_00160a89;
        *(uint **)(*(long *)((long)ppvVar10[2] + 0x30) + uVar34 * 8) = puVar20;
        bVar25 = true;
        if (*(char *)((long)*ppvVar10 + (ulong)*ppvVar10[1]) == '}') {
          ppvVar10[1] = (uint *)((long)ppvVar10[1] + 4);
          if (uVar16 == 0x7fffffff) goto LAB_00160560;
          *(uint *)((long)ppvVar10 + 0x24) = uVar16 - 1;
          bVar36 = false;
        }
        else {
          bVar36 = true;
        }
        goto LAB_0015e0ab;
      }
    }
LAB_0015f86e:
    if (iVar26 != 0) goto LAB_0015d6ad;
    if (!bVar36) {
      iVar26 = 0x13;
      goto LAB_0015d6ad;
    }
    puVar19 = (uint *)ppvVar10[1];
    if (puVar19 <= puVar20) goto LAB_001609de;
    iVar17 = uVar16 + 1;
    if (*(int *)((long)ppvVar10 + 0x24) != iVar17) goto LAB_001609ff;
    iVar26 = 0;
    if (uVar16 == 0) goto LAB_00160a23;
  }
  else {
LAB_0015d6ad:
    puVar19 = (uint *)0x0;
    iVar17 = 0;
    ppvVar10 = (void **)0x0;
  }
  if (iVar26 != 0) goto LAB_0015fcb8;
  puVar20 = (uint *)ppvVar10[1];
  puVar27 = puVar19;
  if (puVar20 == puVar19) {
    if (*(int *)((long)ppvVar10 + 0x24) != iVar17) goto LAB_001608c5;
    puVar27 = puVar20;
    if (iVar17 == 0) goto LAB_001608ee;
  }
  uVar16 = *puVar27;
  cVar1 = *(char *)((long)*ppvVar10 + (ulong)uVar16);
  if (cVar1 == '\"') {
    if (puVar20 == puVar19) {
      if (*(int *)((long)ppvVar10 + 0x24) != iVar17) goto LAB_001608c5;
      if (iVar17 == 0) goto LAB_001608ee;
      ppvVar10[1] = puVar20 + 1;
      if (iVar17 == 0x7fffffff) goto LAB_00160560;
      *(int *)((long)ppvVar10 + 0x24) = iVar17 + -1;
    }
    pcVar23 = (char *)((long)*ppvVar10 + (ulong)uVar16 + 1);
    iVar26 = 0;
  }
  else {
    iVar26 = 0x10;
    pcVar23 = (char *)0x0;
  }
  if (cVar1 == '\"') {
    puVar20 = (uint *)ppvVar10[3];
    do {
      *(char *)puVar20 = *pcVar23;
      if (*pcVar23 == '\"') {
        bVar36 = false;
        puVar19 = puVar20;
      }
      else {
        if (*pcVar23 == '\\') {
          if ((ulong)(byte)pcVar23[1] == 0x75) {
            uVar16 = *(uint *)(&DAT_00190cd0 + (ulong)(byte)pcVar23[3] * 4) |
                     *(uint *)(&DAT_00191018 + (ulong)(byte)pcVar23[2] * 4) |
                     *(uint *)(&DAT_00190988 + (ulong)(byte)pcVar23[4] * 4) |
                     *(uint *)(&simdjson::internal::digit_to_val32 + (ulong)(byte)pcVar23[5] * 4);
            pcVar24 = pcVar23 + 6;
            if ((uVar16 & 0xfffffc00) == 0xd800) {
              if (((*pcVar24 == '\\') && (pcVar23[7] == 'u')) &&
                 (uVar33 = *(uint *)(&DAT_00190cd0 + (ulong)(byte)pcVar23[9] * 4) |
                           *(uint *)(&DAT_00191018 + (ulong)(byte)pcVar23[8] * 4) |
                           *(uint *)(&DAT_00190988 + (ulong)(byte)pcVar23[10] * 4) |
                           *(uint *)(&simdjson::internal::digit_to_val32 +
                                    (ulong)(byte)pcVar23[0xb] * 4), uVar33 < 0x10000)) {
                uVar16 = (uVar33 - 0xdc00 | uVar16 * 0x400 + 0xfca00000) + 0x10000;
                pcVar24 = pcVar23 + 0xc;
                goto LAB_0015d826;
              }
              bVar36 = false;
              pcVar23 = pcVar24;
            }
            else {
LAB_0015d826:
              bVar29 = (byte)uVar16;
              if (uVar16 < 0x80) {
                *(byte *)puVar20 = bVar29;
                lVar32 = 1;
LAB_0015d93b:
                bVar36 = true;
              }
              else {
                if (uVar16 < 0x800) {
                  *(byte *)puVar20 = (byte)(uVar16 >> 6) | 0xc0;
                  *(byte *)((long)puVar20 + 1) = bVar29 & 0x3f | 0x80;
                  lVar32 = 2;
                  goto LAB_0015d93b;
                }
                if (uVar16 < 0x10000) {
                  *(byte *)puVar20 = (byte)(uVar16 >> 0xc) | 0xe0;
                  *(byte *)((long)puVar20 + 1) = (byte)(uVar16 >> 6) & 0x3f | 0x80;
                  *(byte *)((long)puVar20 + 2) = bVar29 & 0x3f | 0x80;
                  lVar32 = 3;
                  goto LAB_0015d93b;
                }
                if (uVar16 < 0x110000) {
                  *(byte *)puVar20 = (byte)(uVar16 >> 0x12) | 0xf0;
                  *(byte *)((long)puVar20 + 1) = (byte)(uVar16 >> 0xc) & 0x3f | 0x80;
                  *(byte *)((long)puVar20 + 2) = (byte)(uVar16 >> 6) & 0x3f | 0x80;
                  *(byte *)((long)puVar20 + 3) = bVar29 & 0x3f | 0x80;
                  lVar32 = 4;
                  goto LAB_0015d93b;
                }
                bVar36 = false;
                lVar32 = 0;
              }
              puVar20 = (uint *)((long)puVar20 + lVar32);
              pcVar23 = pcVar24;
            }
            if (!bVar36) {
              bVar36 = false;
              puVar19 = (uint *)0x0;
              goto LAB_0015d94c;
            }
          }
          else {
            if (simdjson::fallback::(anonymous_namespace)::stringparsing::escape_map
                [(byte)pcVar23[1]] == '\0') {
              bVar36 = false;
              puVar19 = (uint *)0x0;
              goto LAB_0015d94c;
            }
            *(undefined1 *)puVar20 =
                 simdjson::fallback::(anonymous_namespace)::stringparsing::escape_map
                 [(byte)pcVar23[1]];
            pcVar23 = pcVar23 + 2;
            puVar20 = (uint *)((long)puVar20 + 1);
          }
        }
        else {
          pcVar23 = pcVar23 + 1;
          puVar20 = (uint *)((long)puVar20 + 1);
        }
        bVar36 = true;
      }
LAB_0015d94c:
    } while (bVar36);
    if (puVar19 == (uint *)0x0) {
      iVar26 = 5;
      goto LAB_0015d981;
    }
    pvVar8 = ppvVar10[3];
    ppvVar10[3] = puVar19;
    lVar32 = (long)puVar19 - (long)pvVar8;
    iVar26 = 0;
  }
  else {
LAB_0015d981:
    lVar32 = 0;
    pvVar8 = (void *)0x0;
  }
  if (iVar26 != 0) {
LAB_0015fcb8:
    puVar14 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar14 = &PTR__exception_001f1e70;
    *(int *)(puVar14 + 1) = iVar26;
    __cxa_throw(puVar14,&simdjson::simdjson_error::typeinfo,std::exception::~exception);
  }
  event_type._M_dataplus._M_p = (pointer)&event_type.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&event_type,pvVar8,lVar32 + (long)pvVar8);
  puVar20 = (uint *)ppvVar11[1];
  if (puVar20 <= puVar12) goto LAB_00160585;
  if (puVar20 == puVar28) {
    uVar34 = 1;
    bVar36 = true;
LAB_0015da44:
    uVar16 = iVar21 - 1;
    do {
      local_8c0 = (uint)uVar34;
      if ((uVar34 & 1) == 0) {
        if (bVar36) goto LAB_0015dd93;
        *(int *)((long)ppvVar11 + 0x24) = iVar21;
        ppvVar11[1] = puVar28;
        if (iVar21 == 0) goto LAB_00160a89;
        *(uint **)(*(long *)((long)ppvVar11[2] + 0x30) + uVar18 * 8) = puVar12;
        pvVar8 = *ppvVar11;
        local_8c0 = 1;
        if (*(char *)((long)pvVar8 + (ulong)*ppvVar11[1]) == '}') {
          ppvVar11[1] = (uint *)((long)ppvVar11[1] + 4);
          *(uint *)((long)ppvVar11 + 0x24) = uVar16;
          local_8c0 = 0;
        }
        goto LAB_0015de80;
      }
      if (*(int *)((long)ppvVar11 + 0x24) != iVar21) goto LAB_0016047e;
      puVar19 = (uint *)ppvVar11[1];
      if (puVar19 <= puVar12) goto LAB_0016051c;
      if (iVar21 == 0) goto LAB_0016049f;
      pvVar8 = *ppvVar11;
      ppvVar11[1] = puVar19 + 1;
      uVar31 = (ulong)*puVar19;
      if (*(char *)((long)pvVar8 + uVar31) != '\"') {
        *(undefined4 *)(ppvVar11 + 4) = 3;
        uVar31 = 0x300000000;
        goto LAB_0015e3e7;
      }
      if (puVar19 + 1 <= puVar12) goto LAB_0016051c;
      ppvVar11[1] = puVar19 + 2;
      if (*(char *)((long)pvVar8 + (ulong)puVar19[1]) != ':') {
        *(undefined4 *)(ppvVar11 + 4) = 3;
        uVar31 = 0x300000000;
        goto LAB_0015e3e7;
      }
      *(int *)((long)ppvVar11 + 0x24) = iVar21 + 1;
      if ((*(char *)((long)pvVar8 + uVar31 + 6) == '\"') &&
         (*(char *)((long)pvVar8 + uVar31 + 5) == 't' &&
          *(int *)((long)pvVar8 + uVar31 + 1) == 0x6e657665)) goto LAB_0015e094;
      if (puVar19 + 2 <= puVar12) goto LAB_001604d2;
      iVar26 = *(int *)((long)ppvVar11 + 0x24);
      if (iVar26 < iVar21) goto LAB_001604f1;
      bVar30 = true;
      if (iVar21 < iVar26) {
        ppvVar11[1] = puVar19 + 3;
        bVar29 = *(byte *)((long)pvVar8 + (ulong)puVar19[2]);
        if (bVar29 < 0x5d) {
          if ((bVar29 != 0x2c) && ((bVar29 != 0x3a && (bVar29 != 0x5b)))) {
LAB_0015db79:
            *(int *)((long)ppvVar11 + 0x24) = iVar26 + -1;
            if (iVar26 + -1 <= iVar21) goto LAB_0015dbed;
          }
        }
        else if ((bVar29 == 0x7d) || (bVar29 != 0x7b)) goto LAB_0015db79;
        puVar19 = (uint *)ppvVar11[1];
        while (puVar19 < (uint *)((ulong)*(uint *)(*(long *)((long)ppvVar11[2] + 8) + 8) * 4 +
                                 *(long *)(*(long *)((long)ppvVar11[2] + 8) + 0x10))) {
          ppvVar11[1] = puVar19 + 1;
          bVar29 = *(byte *)((long)pvVar8 + (ulong)*puVar19);
          if (bVar29 < 0x7b) {
            if (bVar29 == 0x5b) {
LAB_0015dbd2:
              *(int *)((long)ppvVar11 + 0x24) = *(int *)((long)ppvVar11 + 0x24) + 1;
            }
            else if (bVar29 == 0x5d) goto LAB_0015dbd7;
          }
          else {
            if (bVar29 != 0x7d) {
              if (bVar29 != 0x7b) goto LAB_0015dbe7;
              goto LAB_0015dbd2;
            }
LAB_0015dbd7:
            iVar26 = *(int *)((long)ppvVar11 + 0x24) + -1;
            *(int *)((long)ppvVar11 + 0x24) = iVar26;
            if (iVar26 <= iVar21) goto LAB_0015dbed;
          }
LAB_0015dbe7:
          puVar19 = (uint *)ppvVar11[1];
        }
        *(undefined4 *)(ppvVar11 + 4) = 3;
        bVar30 = false;
        uVar31 = 0x300000000;
      }
      else {
LAB_0015dbed:
        uVar31 = 0;
      }
      bVar25 = false;
      if (!bVar30) goto LAB_0015e3f6;
      puVar19 = (uint *)ppvVar11[1];
      if (puVar19 <= puVar12) goto LAB_0016051c;
      if (*(int *)((long)ppvVar11 + 0x24) != iVar21) goto LAB_0016053b;
      ppvVar11[1] = puVar19 + 1;
      bVar25 = true;
      if (*(char *)((long)pvVar8 + (ulong)*puVar19) == ',') {
        uVar31 = 1;
      }
      else if (*(char *)((long)pvVar8 + (ulong)*puVar19) == '}') {
        if (0x7ffffffd < uVar16) goto LAB_00160560;
        *(uint *)((long)ppvVar11 + 0x24) = uVar16;
        uVar31 = 0;
      }
      else {
        *(undefined4 *)(ppvVar11 + 4) = 3;
        bVar25 = false;
        uVar31 = 0x300000000;
      }
      if (bVar25) {
        uVar34 = uVar31 & 0xffffffff;
      }
      local_8c0 = (uint)uVar34;
    } while (bVar25);
LAB_0015e3d5:
    uVar31 = uVar31 & 0x300000000;
LAB_0015e3e7:
    bVar25 = false;
    ppvVar11[2] = (void *)0x0;
    *(undefined4 *)((long)ppvVar11 + 0x24) = 0;
  }
  else {
    iVar26 = *(int *)((long)ppvVar11 + 0x24);
    if (iVar21 <= iVar26) {
      bVar36 = true;
      if (iVar21 < iVar26) {
        ppvVar11[1] = puVar20 + 1;
        bVar29 = *(byte *)((long)*ppvVar11 + (ulong)*puVar20);
        if (bVar29 < 0x5d) {
          if ((bVar29 != 0x2c) && ((bVar29 != 0x3a && (bVar29 != 0x5b)))) {
LAB_0015ddad:
            *(int *)((long)ppvVar11 + 0x24) = iVar26 + -1;
            if (iVar26 + -1 <= iVar21) {
LAB_0015e327:
              uVar31 = 0;
              goto LAB_0015e32a;
            }
          }
        }
        else if ((bVar29 == 0x7d) || (bVar29 != 0x7b)) goto LAB_0015ddad;
        puVar20 = (uint *)ppvVar11[1];
        while (puVar20 < (uint *)((ulong)*(uint *)(*(long *)((long)ppvVar11[2] + 8) + 8) * 4 +
                                 *(long *)(*(long *)((long)ppvVar11[2] + 8) + 0x10))) {
          ppvVar11[1] = puVar20 + 1;
          bVar29 = *(byte *)((long)*ppvVar11 + (ulong)*puVar20);
          if (bVar29 < 0x7b) {
            if (bVar29 == 0x5b) {
LAB_0015de01:
              *(int *)((long)ppvVar11 + 0x24) = *(int *)((long)ppvVar11 + 0x24) + 1;
            }
            else if (bVar29 == 0x5d) goto LAB_0015de06;
          }
          else {
            if (bVar29 != 0x7d) {
              if (bVar29 != 0x7b) goto LAB_0015de17;
              goto LAB_0015de01;
            }
LAB_0015de06:
            iVar26 = *(int *)((long)ppvVar11 + 0x24) + -1;
            *(int *)((long)ppvVar11 + 0x24) = iVar26;
            if (iVar26 <= iVar21) goto LAB_0015e327;
          }
LAB_0015de17:
          puVar20 = (uint *)ppvVar11[1];
        }
        *(undefined4 *)(ppvVar11 + 4) = 3;
        bVar36 = false;
        uVar31 = 0x300000000;
      }
      else {
        uVar31 = 0;
      }
LAB_0015e32a:
      if (bVar36) {
        puVar20 = (uint *)ppvVar11[1];
        if (puVar20 <= puVar12) goto LAB_0016051c;
        if (*(int *)((long)ppvVar11 + 0x24) != iVar21) goto LAB_0016053b;
        if (iVar21 == 0) goto LAB_0016049f;
        ppvVar11[1] = puVar20 + 1;
        bVar36 = true;
        if (*(char *)((long)*ppvVar11 + (ulong)*puVar20) == ',') {
          uVar31 = 1;
        }
        else if (*(char *)((long)*ppvVar11 + (ulong)*puVar20) == '}') {
          if (0x7ffffffd < iVar21 - 1U) goto LAB_00160560;
          *(uint *)((long)ppvVar11 + 0x24) = iVar21 - 1U;
          uVar31 = 0;
        }
        else {
          *(undefined4 *)(ppvVar11 + 4) = 3;
          bVar36 = false;
          uVar31 = 0x300000000;
        }
        uVar34 = (ulong)(local_8c0 & 0xff);
        if (bVar36) {
          uVar34 = uVar31 & 0xffffffff;
        }
        local_8c0 = (uint)uVar34;
        if (bVar36) {
          if (*(uint **)(*(long *)((long)ppvVar11[2] + 0x30) + uVar18 * 8) == puVar12) {
            bVar36 = false;
            goto LAB_0015da44;
          }
          uVar31 = 0x1900000000;
          bVar25 = false;
          goto LAB_0015e3f6;
        }
        goto LAB_0015e3d5;
      }
      goto LAB_0015e3e7;
    }
    uVar16 = iVar21 - 1;
    uVar31 = 0x1900000000;
    bVar25 = false;
    if ((int)uVar16 <= iVar26) {
      *(int *)((long)ppvVar11 + 0x24) = iVar21;
      ppvVar11[1] = puVar28;
      if (iVar21 == 0) goto LAB_00160a89;
      *(uint **)(*(long *)((long)ppvVar11[2] + 0x30) + uVar18 * 8) = puVar12;
      bVar36 = true;
      if (*(char *)((long)*ppvVar11 + (ulong)*ppvVar11[1]) == '}') {
        ppvVar11[1] = (uint *)((long)ppvVar11[1] + 4);
        if (0x7ffffffd < uVar16) goto LAB_00160560;
        *(uint *)((long)ppvVar11 + 0x24) = uVar16;
        uVar34 = 0;
      }
      else {
        uVar34 = 1;
      }
      goto LAB_0015da44;
    }
  }
LAB_0015e3f6:
  iVar26 = (int)(uVar31 >> 0x20);
  if (uVar31 == 0) {
    if (bVar25) {
      puVar20 = (uint *)ppvVar11[1];
      if (puVar20 <= puVar12) goto LAB_001609de;
      uVar18 = (ulong)(iVar21 + 1U);
      if (*(uint *)((long)ppvVar11 + 0x24) != iVar21 + 1U) goto LAB_001609ff;
      iVar26 = 0;
      if (iVar21 == 0) goto LAB_00160a23;
    }
    else {
      puVar20 = (uint *)0x0;
      iVar26 = 0x13;
      uVar18 = 0;
      ppvVar11 = (void **)0x0;
    }
  }
  else {
    puVar20 = (uint *)0x0;
    uVar18 = 0;
    ppvVar11 = (void **)0x0;
  }
  if (iVar26 == 0) {
    puVar12 = (uint *)ppvVar11[1];
    if (puVar12 == puVar20) {
      iVar21 = (int)uVar18;
      if (*(int *)((long)ppvVar11 + 0x24) != iVar21) goto LAB_001608c5;
      if (iVar21 == 0) goto LAB_001608ee;
      iVar26 = 0x10;
      if (*(char *)((long)*ppvVar11 + (ulong)*puVar12) == '{') {
        ppvVar11[1] = puVar12 + 1;
        if ((uint *)ppvVar11[1] != puVar20 + 1) goto LAB_00160767;
        if (*(int *)((long)ppvVar11 + 0x24) != iVar21) {
LAB_0016072f:
          __assert_fail("_json_iter->_depth == _depth",
                        "/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/simdjson/simdjson.h"
                        ,0x6762,
                        "void simdjson::fallback::ondemand::value_iterator::assert_at_container_start() const"
                       );
        }
        *(uint **)(*(long *)((long)ppvVar11[2] + 0x30) + uVar18 * 8) = puVar20;
        if (*(char *)((long)*ppvVar11 + (ulong)*ppvVar11[1]) == '}') {
          ppvVar11[1] = (uint *)((long)ppvVar11[1] + 4);
          if (iVar21 == 0x7fffffff) goto LAB_00160560;
          *(int *)((long)ppvVar11 + 0x24) = iVar21 + -1;
        }
        iVar26 = 0;
      }
      if (iVar26 == 0) goto LAB_0015e473;
      ppvVar11 = (void **)0x0;
      uVar18 = 0;
      puVar20 = (uint *)0x0;
    }
    else {
LAB_0015e473:
      iVar26 = 0;
    }
    if (iVar26 != 0) goto LAB_0015e575;
    puVar12 = (uint *)ppvVar11[1];
    if (puVar12 <= puVar20) {
LAB_00160585:
      __assert_fail("_json_iter->token._position > _start_position",
                    "/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/simdjson/simdjson.h"
                    ,0x66d5,
                    "bool simdjson::fallback::ondemand::value_iterator::at_first_field() const");
    }
    puVar28 = puVar20 + 1;
    uVar16 = (uint)uVar18;
    if (puVar12 == puVar28) {
      bVar25 = true;
      bVar36 = true;
LAB_0015ed86:
      uVar33 = uVar16 - 1;
      do {
        if (!bVar25) {
          if (bVar36) goto LAB_0015f0fc;
          *(uint *)((long)ppvVar11 + 0x24) = uVar16;
          ppvVar11[1] = puVar28;
          if (uVar16 == 0) goto LAB_00160a89;
          *(uint **)(*(long *)((long)ppvVar11[2] + 0x30) + uVar18 * 8) = puVar20;
          pvVar8 = *ppvVar11;
          bVar36 = true;
          if (*(char *)((long)pvVar8 + (ulong)*ppvVar11[1]) != '}') goto LAB_0015f537;
          ppvVar11[1] = (uint *)((long)ppvVar11[1] + 4);
          if (0x7ffffffd < uVar33) goto LAB_00160560;
          *(uint *)((long)ppvVar11 + 0x24) = uVar33;
          bVar36 = false;
          goto LAB_0015f537;
        }
        if (*(uint *)((long)ppvVar11 + 0x24) != uVar16) {
LAB_0016047e:
          __assert_fail("_json_iter->_depth == _depth",
                        "/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/simdjson/simdjson.h"
                        ,0x6534,
                        "simdjson_result<bool> simdjson::fallback::ondemand::value_iterator::find_field_unordered_raw(const std::string_view)"
                       );
        }
        puVar19 = (uint *)ppvVar11[1];
        if (puVar19 <= puVar20) goto LAB_0016051c;
        if (uVar16 == 0) goto LAB_0016049f;
        pvVar8 = *ppvVar11;
        ppvVar11[1] = puVar19 + 1;
        uVar34 = (ulong)*puVar19;
        if (*(char *)((long)pvVar8 + uVar34) != '\"') {
          *(undefined4 *)(ppvVar11 + 4) = 3;
          iVar26 = 3;
          break;
        }
        if (puVar19 + 1 <= puVar20) goto LAB_0016051c;
        ppvVar11[1] = puVar19 + 2;
        cVar1 = *(char *)((long)pvVar8 + (ulong)puVar19[1]);
        if (cVar1 == ':') {
          if (0x7ffffffd < uVar16) goto LAB_001607f1;
          *(uint *)((long)ppvVar11 + 0x24) = uVar16 + 1;
          iVar26 = 0;
        }
        else {
          *(undefined4 *)(ppvVar11 + 4) = 3;
          iVar26 = 3;
        }
        if (cVar1 != ':') break;
        if ((*(char *)((long)pvVar8 + uVar34 + 0xc) == '\"') &&
           (*(long *)((long)pvVar8 + uVar34 + 4) == 0x65646f437972746e &&
            *(long *)((long)pvVar8 + uVar34 + 1) == 0x437972746e756f63)) goto LAB_0015f78a;
        if (puVar19 + 2 <= puVar20) goto LAB_001604d2;
        iVar21 = *(int *)((long)ppvVar11 + 0x24);
        if (iVar21 < (int)uVar16) goto LAB_001604f1;
        bVar30 = true;
        if ((int)uVar16 < iVar21) {
          ppvVar11[1] = puVar19 + 3;
          bVar29 = *(byte *)((long)pvVar8 + (ulong)puVar19[2]);
          if (bVar29 < 0x5d) {
            if ((bVar29 != 0x2c) && ((bVar29 != 0x3a && (bVar29 != 0x5b)))) {
LAB_0015eefc:
              *(int *)((long)ppvVar11 + 0x24) = iVar21 + -1;
              if (iVar21 + -1 <= (int)uVar16) goto LAB_0015ef71;
            }
          }
          else if ((bVar29 == 0x7d) || (bVar29 != 0x7b)) goto LAB_0015eefc;
          puVar19 = (uint *)ppvVar11[1];
          while (puVar19 < (uint *)((ulong)*(uint *)(*(long *)((long)ppvVar11[2] + 8) + 8) * 4 +
                                   *(long *)(*(long *)((long)ppvVar11[2] + 8) + 0x10))) {
            ppvVar11[1] = puVar19 + 1;
            bVar29 = *(byte *)((long)pvVar8 + (ulong)*puVar19);
            if (bVar29 < 0x7b) {
              if (bVar29 == 0x5b) {
LAB_0015ef58:
                *(int *)((long)ppvVar11 + 0x24) = *(int *)((long)ppvVar11 + 0x24) + 1;
              }
              else if (bVar29 == 0x5d) goto LAB_0015ef5d;
            }
            else {
              if (bVar29 != 0x7d) {
                if (bVar29 != 0x7b) goto LAB_0015ef6b;
                goto LAB_0015ef58;
              }
LAB_0015ef5d:
              iVar21 = *(int *)((long)ppvVar11 + 0x24) + -1;
              *(int *)((long)ppvVar11 + 0x24) = iVar21;
              if (iVar21 <= (int)uVar16) goto LAB_0015ef71;
            }
LAB_0015ef6b:
            puVar19 = (uint *)ppvVar11[1];
          }
          *(undefined4 *)(ppvVar11 + 4) = 3;
          bVar30 = false;
          iVar26 = 3;
        }
        else {
LAB_0015ef71:
          iVar26 = 0;
        }
        bVar25 = false;
        if (!bVar30) goto LAB_0015f9b2;
        puVar19 = (uint *)ppvVar11[1];
        if (puVar19 <= puVar20) goto LAB_0016051c;
        if (*(uint *)((long)ppvVar11 + 0x24) != uVar16) goto LAB_0016053b;
        ppvVar11[1] = puVar19 + 1;
        bVar30 = true;
        if (*(char *)((long)pvVar8 + (ulong)*puVar19) == ',') {
          iVar26 = 0;
          bVar25 = true;
        }
        else if (*(char *)((long)pvVar8 + (ulong)*puVar19) == '}') {
          if (0x7ffffffd < uVar33) goto LAB_00160560;
          *(uint *)((long)ppvVar11 + 0x24) = uVar33;
          iVar26 = 0;
          bVar25 = false;
        }
        else {
          *(undefined4 *)(ppvVar11 + 4) = 3;
          bVar30 = false;
          iVar26 = 3;
          bVar25 = false;
        }
      } while (bVar30);
LAB_0015f9a3:
      bVar25 = false;
      ppvVar11[2] = (void *)0x0;
      *(undefined4 *)((long)ppvVar11 + 0x24) = 0;
    }
    else {
      iVar21 = *(int *)((long)ppvVar11 + 0x24);
      if ((int)uVar16 <= iVar21) {
        bVar36 = true;
        if ((int)uVar16 < iVar21) {
          ppvVar11[1] = puVar12 + 1;
          bVar29 = *(byte *)((long)*ppvVar11 + (ulong)*puVar12);
          if (bVar29 < 0x5d) {
            if ((bVar29 != 0x2c) && ((bVar29 != 0x3a && (bVar29 != 0x5b)))) {
LAB_0015f1b6:
              *(int *)((long)ppvVar11 + 0x24) = iVar21 + -1;
              if (iVar21 + -1 <= (int)uVar16) {
LAB_0015f8d9:
                iVar26 = 0;
                goto LAB_0015f8e1;
              }
            }
          }
          else if ((bVar29 == 0x7d) || (bVar29 != 0x7b)) goto LAB_0015f1b6;
          puVar12 = (uint *)ppvVar11[1];
          while (puVar12 < (uint *)((ulong)*(uint *)(*(long *)((long)ppvVar11[2] + 8) + 8) * 4 +
                                   *(long *)(*(long *)((long)ppvVar11[2] + 8) + 0x10))) {
            ppvVar11[1] = puVar12 + 1;
            bVar29 = *(byte *)((long)*ppvVar11 + (ulong)*puVar12);
            if (bVar29 < 0x7b) {
              if (bVar29 == 0x5b) {
LAB_0015f20b:
                *(int *)((long)ppvVar11 + 0x24) = *(int *)((long)ppvVar11 + 0x24) + 1;
              }
              else if (bVar29 == 0x5d) goto LAB_0015f210;
            }
            else {
              if (bVar29 != 0x7d) {
                if (bVar29 != 0x7b) goto LAB_0015f222;
                goto LAB_0015f20b;
              }
LAB_0015f210:
              iVar21 = *(int *)((long)ppvVar11 + 0x24) + -1;
              *(int *)((long)ppvVar11 + 0x24) = iVar21;
              if (iVar21 <= (int)uVar16) goto LAB_0015f8d9;
            }
LAB_0015f222:
            puVar12 = (uint *)ppvVar11[1];
          }
          *(undefined4 *)(ppvVar11 + 4) = 3;
          bVar36 = false;
          iVar26 = 3;
        }
        else {
          iVar26 = 0;
        }
LAB_0015f8e1:
        if (bVar36) {
          puVar12 = (uint *)ppvVar11[1];
          if (puVar12 <= puVar20) goto LAB_0016051c;
          if (*(uint *)((long)ppvVar11 + 0x24) != uVar16) goto LAB_0016053b;
          if (uVar16 == 0) goto LAB_0016049f;
          ppvVar11[1] = puVar12 + 1;
          bVar36 = true;
          if (*(char *)((long)*ppvVar11 + (ulong)*puVar12) == ',') {
            iVar26 = 0;
            bVar25 = true;
          }
          else if (*(char *)((long)*ppvVar11 + (ulong)*puVar12) == '}') {
            if (uVar16 == 0x7fffffff) goto LAB_00160560;
            *(uint *)((long)ppvVar11 + 0x24) = uVar16 - 1;
            iVar26 = 0;
            bVar25 = false;
          }
          else {
            *(undefined4 *)(ppvVar11 + 4) = 3;
            bVar36 = false;
            iVar26 = 3;
            bVar25 = false;
          }
          if (bVar36) {
            if (*(uint **)(*(long *)((long)ppvVar11[2] + 0x30) + uVar18 * 8) == puVar20) {
              bVar36 = false;
              goto LAB_0015ed86;
            }
            iVar26 = 0x19;
            bVar25 = false;
            goto LAB_0015f9b2;
          }
        }
        goto LAB_0015f9a3;
      }
      iVar26 = 0x19;
      bVar25 = false;
      if ((int)(uVar16 - 1) <= iVar21) {
        *(uint *)((long)ppvVar11 + 0x24) = uVar16;
        ppvVar11[1] = puVar28;
        if (uVar16 == 0) {
LAB_00160a89:
          __assert_fail("_depth > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/simdjson/simdjson.h"
                        ,0x6763,
                        "void simdjson::fallback::ondemand::value_iterator::assert_at_container_start() const"
                       );
        }
        *(uint **)(*(long *)((long)ppvVar11[2] + 0x30) + uVar18 * 8) = puVar20;
        bVar36 = true;
        if (*(char *)((long)*ppvVar11 + (ulong)*ppvVar11[1]) == '}') {
          ppvVar11[1] = (uint *)((long)ppvVar11[1] + 4);
          if (uVar16 == 0x7fffffff) goto LAB_00160560;
          *(uint *)((long)ppvVar11 + 0x24) = uVar16 - 1;
          bVar25 = false;
        }
        else {
          bVar25 = true;
        }
        goto LAB_0015ed86;
      }
    }
LAB_0015f9b2:
    if (iVar26 != 0) goto LAB_0015e575;
    if (!bVar25) {
      iVar26 = 0x13;
      goto LAB_0015e575;
    }
    puVar12 = (uint *)ppvVar11[1];
    if (puVar12 <= puVar20) {
LAB_001609de:
      __assert_fail("_json_iter->token._position > _start_position",
                    "/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/simdjson/simdjson.h"
                    ,0x6781,
                    "void simdjson::fallback::ondemand::value_iterator::assert_at_child() const");
    }
    iVar21 = uVar16 + 1;
    if (*(int *)((long)ppvVar11 + 0x24) != iVar21) {
LAB_001609ff:
      __assert_fail("_json_iter->_depth == _depth + 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/simdjson/simdjson.h"
                    ,0x6782,
                    "void simdjson::fallback::ondemand::value_iterator::assert_at_child() const");
    }
    iVar26 = 0;
    if (uVar16 == 0) {
LAB_00160a23:
      __assert_fail("_depth > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/simdjson/simdjson.h"
                    ,0x6783,
                    "void simdjson::fallback::ondemand::value_iterator::assert_at_child() const");
    }
  }
  else {
LAB_0015e575:
    puVar12 = (uint *)0x0;
    iVar21 = 0;
    ppvVar11 = (void **)0x0;
  }
  if (iVar26 != 0) goto LAB_0015fcea;
  puVar20 = (uint *)ppvVar11[1];
  puVar28 = puVar12;
  if (puVar20 == puVar12) {
    if (*(int *)((long)ppvVar11 + 0x24) != iVar21) goto LAB_001608c5;
    puVar28 = puVar20;
    if (iVar21 == 0) goto LAB_001608ee;
  }
  uVar16 = *puVar28;
  cVar1 = *(char *)((long)*ppvVar11 + (ulong)uVar16);
  if (cVar1 == '\"') {
    if (puVar20 == puVar12) {
      if (*(int *)((long)ppvVar11 + 0x24) != iVar21) goto LAB_001608c5;
      if (iVar21 == 0) {
LAB_001608ee:
        __assert_fail("_depth > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/simdjson/simdjson.h"
                      ,0x675d,
                      "void simdjson::fallback::ondemand::value_iterator::assert_at_start() const");
      }
      ppvVar11[1] = puVar20 + 1;
      if (iVar21 == 0x7fffffff) {
LAB_00160560:
        __assert_fail("parent_depth >= 0 && parent_depth < (2147483647) - 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/simdjson/simdjson.h"
                      ,0x63d6,"void simdjson::fallback::ondemand::json_iterator::ascend_to(depth_t)"
                     );
      }
      *(int *)((long)ppvVar11 + 0x24) = iVar21 + -1;
    }
    pcVar23 = (char *)((long)*ppvVar11 + (ulong)uVar16 + 1);
    iVar26 = 0;
  }
  else {
    iVar26 = 0x10;
    pcVar23 = (char *)0x0;
  }
  if (cVar1 == '\"') {
    puVar20 = (uint *)ppvVar11[3];
    do {
      *(char *)puVar20 = *pcVar23;
      if (*pcVar23 == '\"') {
        bVar36 = false;
        puVar12 = puVar20;
      }
      else {
        if (*pcVar23 == '\\') {
          if ((ulong)(byte)pcVar23[1] == 0x75) {
            uVar16 = *(uint *)(&DAT_00190cd0 + (ulong)(byte)pcVar23[3] * 4) |
                     *(uint *)(&DAT_00191018 + (ulong)(byte)pcVar23[2] * 4) |
                     *(uint *)(&DAT_00190988 + (ulong)(byte)pcVar23[4] * 4) |
                     *(uint *)(&simdjson::internal::digit_to_val32 + (ulong)(byte)pcVar23[5] * 4);
            pcVar24 = pcVar23 + 6;
            if ((uVar16 & 0xfffffc00) == 0xd800) {
              if (((*pcVar24 == '\\') && (pcVar23[7] == 'u')) &&
                 (uVar33 = *(uint *)(&DAT_00190cd0 + (ulong)(byte)pcVar23[9] * 4) |
                           *(uint *)(&DAT_00191018 + (ulong)(byte)pcVar23[8] * 4) |
                           *(uint *)(&DAT_00190988 + (ulong)(byte)pcVar23[10] * 4) |
                           *(uint *)(&simdjson::internal::digit_to_val32 +
                                    (ulong)(byte)pcVar23[0xb] * 4), uVar33 < 0x10000)) {
                uVar16 = (uVar33 - 0xdc00 | uVar16 * 0x400 + 0xfca00000) + 0x10000;
                pcVar24 = pcVar23 + 0xc;
                goto LAB_0015e6ee;
              }
              bVar36 = false;
              pcVar23 = pcVar24;
            }
            else {
LAB_0015e6ee:
              bVar29 = (byte)uVar16;
              if (uVar16 < 0x80) {
                *(byte *)puVar20 = bVar29;
                lVar32 = 1;
LAB_0015e803:
                bVar36 = true;
              }
              else {
                if (uVar16 < 0x800) {
                  *(byte *)puVar20 = (byte)(uVar16 >> 6) | 0xc0;
                  *(byte *)((long)puVar20 + 1) = bVar29 & 0x3f | 0x80;
                  lVar32 = 2;
                  goto LAB_0015e803;
                }
                if (uVar16 < 0x10000) {
                  *(byte *)puVar20 = (byte)(uVar16 >> 0xc) | 0xe0;
                  *(byte *)((long)puVar20 + 1) = (byte)(uVar16 >> 6) & 0x3f | 0x80;
                  *(byte *)((long)puVar20 + 2) = bVar29 & 0x3f | 0x80;
                  lVar32 = 3;
                  goto LAB_0015e803;
                }
                if (uVar16 < 0x110000) {
                  *(byte *)puVar20 = (byte)(uVar16 >> 0x12) | 0xf0;
                  *(byte *)((long)puVar20 + 1) = (byte)(uVar16 >> 0xc) & 0x3f | 0x80;
                  *(byte *)((long)puVar20 + 2) = (byte)(uVar16 >> 6) & 0x3f | 0x80;
                  *(byte *)((long)puVar20 + 3) = bVar29 & 0x3f | 0x80;
                  lVar32 = 4;
                  goto LAB_0015e803;
                }
                bVar36 = false;
                lVar32 = 0;
              }
              puVar20 = (uint *)((long)puVar20 + lVar32);
              pcVar23 = pcVar24;
            }
            if (!bVar36) {
              bVar36 = false;
              puVar12 = (uint *)0x0;
              goto LAB_0015e814;
            }
          }
          else {
            if (simdjson::fallback::(anonymous_namespace)::stringparsing::escape_map
                [(byte)pcVar23[1]] == '\0') {
              bVar36 = false;
              puVar12 = (uint *)0x0;
              goto LAB_0015e814;
            }
            *(undefined1 *)puVar20 =
                 simdjson::fallback::(anonymous_namespace)::stringparsing::escape_map
                 [(byte)pcVar23[1]];
            pcVar23 = pcVar23 + 2;
            puVar20 = (uint *)((long)puVar20 + 1);
          }
        }
        else {
          pcVar23 = pcVar23 + 1;
          puVar20 = (uint *)((long)puVar20 + 1);
        }
        bVar36 = true;
      }
LAB_0015e814:
    } while (bVar36);
    if (puVar12 == (uint *)0x0) {
      iVar26 = 5;
      goto LAB_0015e849;
    }
    pvVar8 = ppvVar11[3];
    ppvVar11[3] = puVar12;
    lVar32 = (long)puVar12 - (long)pvVar8;
    iVar26 = 0;
  }
  else {
LAB_0015e849:
    lVar32 = 0;
    pvVar8 = (void *)0x0;
  }
  if (iVar26 != 0) {
LAB_0015fcea:
    puVar14 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar14 = &PTR__exception_001f1e70;
    *(int *)(puVar14 + 1) = iVar26;
    __cxa_throw(puVar14,&simdjson::simdjson_error::typeinfo,std::exception::~exception);
  }
  country_code._M_dataplus._M_p = (pointer)&country_code.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&country_code,pvVar8,lVar32 + (long)pvVar8);
  local_708._M_dataplus._M_p = (pointer)&local_708.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_708,m_tm._M_dataplus._M_p,
             m_tm._M_dataplus._M_p + m_tm._M_string_length);
  local_728._M_dataplus._M_p = (pointer)&local_728.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_728,event_type._M_dataplus._M_p,
             event_type._M_dataplus._M_p + event_type._M_string_length);
  local_5c8._M_dataplus._M_p = (pointer)&local_5c8.field_2;
  in_RCX = &local_5c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)in_RCX,country_code._M_dataplus._M_p,
             country_code._M_dataplus._M_p + country_code._M_string_length);
  Market_Projection::Market_Projection(&local_538,&local_708,&local_728,in_RCX);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_hedg::Market_Projection,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>
              *)local_4d8,&m_id,&local_538);
  std::
  deque<std::pair<std::__cxx11::string,hedg::Market_Projection>,std::allocator<std::pair<std::__cxx11::string,hedg::Market_Projection>>>
  ::emplace_back<std::pair<std::__cxx11::string,hedg::Market_Projection>>
            ((deque<std::pair<std::__cxx11::string,hedg::Market_Projection>,std::allocator<std::pair<std::__cxx11::string,hedg::Market_Projection>>>
              *)&this->markets_,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>
              *)local_4d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._M_p != &local_468) {
    operator_delete(local_478._M_p,local_468._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_p != &local_488) {
    operator_delete(local_498._M_p,(ulong)(local_488._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._32_8_ != &local_4a8) {
    operator_delete((void *)local_4d8._32_8_,local_4a8._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_4d8._0_8_ != local_4d8 + 0x10) {
    operator_delete((void *)local_4d8._0_8_,local_4d8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538.country_code_._M_dataplus._M_p != &local_538.country_code_.field_2) {
    operator_delete(local_538.country_code_._M_dataplus._M_p,
                    local_538.country_code_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538.event_type_._M_dataplus._M_p != &local_538.event_type_.field_2) {
    operator_delete(local_538.event_type_._M_dataplus._M_p,
                    local_538.event_type_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538.market_start_time_._M_dataplus._M_p != &local_538.market_start_time_.field_2) {
    operator_delete(local_538.market_start_time_._M_dataplus._M_p,
                    local_538.market_start_time_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
    operator_delete(local_5c8._M_dataplus._M_p,local_5c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_728._M_dataplus._M_p != &local_728.field_2) {
    operator_delete(local_728._M_dataplus._M_p,local_728.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_708._M_dataplus._M_p != &local_708.field_2) {
    operator_delete(local_708._M_dataplus._M_p,local_708.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)country_code._M_dataplus._M_p != &country_code.field_2) {
    operator_delete(country_code._M_dataplus._M_p,country_code.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)event_type._M_dataplus._M_p != &event_type.field_2) {
    operator_delete(event_type._M_dataplus._M_p,event_type.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)m_tm._M_dataplus._M_p != &m_tm.field_2) {
    operator_delete(m_tm._M_dataplus._M_p,m_tm.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)m_id._M_dataplus._M_p != &m_id.field_2) {
    operator_delete(m_id._M_dataplus._M_p,m_id.field_2._M_allocated_capacity + 1);
  }
  ppvVar11 = local_790;
  if (iVar6 != 0) goto LAB_0015fa3c;
  if (*(int *)(local_790 + 4) != 0) goto LAB_0015b77c;
  puVar12 = (uint *)local_790[1];
  if (puVar12 <= local_898) {
LAB_001604d2:
    __assert_fail("_json_iter->token._position > _start_position",
                  "/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/simdjson/simdjson.h"
                  ,0x66b7,"error_code simdjson::fallback::ondemand::value_iterator::skip_child()");
  }
  iVar21 = *(int *)((long)local_790 + 0x24);
  if (iVar21 < (int)uVar7) {
LAB_001604f1:
    __assert_fail("_json_iter->_depth >= _depth",
                  "/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/simdjson/simdjson.h"
                  ,0x66b8,"error_code simdjson::fallback::ondemand::value_iterator::skip_child()");
  }
  if ((int)uVar7 < iVar21) {
    pvVar8 = *local_790;
    local_790[1] = puVar12 + 1;
    bVar29 = *(byte *)((long)pvVar8 + (ulong)*puVar12);
    if (bVar29 < 0x5d) {
      if ((bVar29 == 0x2c) || ((bVar29 == 0x3a || (bVar29 == 0x5b)))) goto LAB_0015ec9b;
    }
    else if ((bVar29 != 0x7d) && (bVar29 == 0x7b)) goto LAB_0015ec9b;
    *(int *)((long)ppvVar11 + 0x24) = iVar21 + -1;
    if ((int)uVar7 < iVar21 + -1) {
LAB_0015ec9b:
      in_RCX = (string *)ppvVar11[2];
      puVar12 = (uint *)ppvVar11[1];
      while (puVar12 < (uint *)((ulong)*(uint *)(in_RCX->_M_string_length + 8) * 4 +
                               *(long *)(in_RCX->_M_string_length + 0x10))) {
        ppvVar11[1] = puVar12 + 1;
        bVar29 = *(byte *)((long)pvVar8 + (ulong)*puVar12);
        if (bVar29 < 0x7b) {
          if (bVar29 == 0x5b) {
LAB_0015ecea:
            *(int *)((long)ppvVar11 + 0x24) = *(int *)((long)ppvVar11 + 0x24) + 1;
          }
          else if (bVar29 == 0x5d) goto LAB_0015ecef;
        }
        else {
          if (bVar29 != 0x7d) {
            if (bVar29 != 0x7b) goto LAB_0015ecfd;
            goto LAB_0015ecea;
          }
LAB_0015ecef:
          iVar21 = *(int *)((long)ppvVar11 + 0x24) + -1;
          *(int *)((long)ppvVar11 + 0x24) = iVar21;
          if (iVar21 <= (int)uVar7) goto LAB_0015ed03;
        }
LAB_0015ecfd:
        puVar12 = (uint *)ppvVar11[1];
      }
      *(undefined4 *)(ppvVar11 + 4) = 3;
      goto LAB_0015b77c;
    }
  }
LAB_0015ed03:
  puVar12 = (uint *)ppvVar11[1];
  if (local_898 < puVar12) {
    if (*(uint *)((long)ppvVar11 + 0x24) == uVar7) {
      if (uVar7 != 0) {
        in_RCX = (string *)*ppvVar11;
        ppvVar11[1] = puVar12 + 1;
        cVar1 = *(char *)((long)&(in_RCX->_M_dataplus)._M_p + (ulong)*puVar12);
        if (cVar1 == ',') {
          *(uint *)((long)ppvVar11 + 0x24) = uVar15;
        }
        else if (cVar1 == ']') {
          *(uint *)((long)ppvVar11 + 0x24) = uVar7 - 1;
        }
        else {
          *(undefined4 *)(ppvVar11 + 4) = 3;
        }
        goto LAB_0015b77c;
      }
LAB_0016049f:
      __assert_fail("_depth > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/simdjson/simdjson.h"
                    ,0x6769,
                    "void simdjson::fallback::ondemand::value_iterator::assert_at_next() const");
    }
LAB_0016053b:
    __assert_fail("_json_iter->_depth == _depth",
                  "/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/simdjson/simdjson.h"
                  ,0x6768,
                  "void simdjson::fallback::ondemand::value_iterator::assert_at_next() const");
  }
LAB_0016051c:
  __assert_fail("_json_iter->token._position > _start_position",
                "/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/simdjson/simdjson.h"
                ,0x6767,"void simdjson::fallback::ondemand::value_iterator::assert_at_next() const")
  ;
}

Assistant:

void MarketGenerator::generate() {
	
	for (;;) {

		{
			std::scoped_lock<std::mutex> lk(mut_);

			try {
				session_id_ = Betfair_Auth::get_session_id();

				std::string start_time = Timing::now();
				std::string end_time = Timing::after(time_span_, time_unit_);

				io_service service;
				ssl::context context{ ssl::context::tlsv12_client };

				Client<Rest_Client> rest_cl{ config::betting_host, config::betting_port, service, context };
				rest_cl.send_request(rest::message<params::market_catalogue>, params::market_catalogue(session_id_, start_time, end_time));
				simdjson::padded_string p_d{ std::move(rest_cl.recv_response()) };

				simdjson::ondemand::parser parser;

				for (simdjson::ondemand::object market : parser.iterate(p_d)) {
					std::string m_id = std::string(std::string_view(market["marketId"]));
					std::string m_tm = std::string(std::string_view(market["marketStartTime"]));
					std::string event_type = std::string(std::string_view(market["eventType"]["id"]));
					std::string country_code = std::string(std::string_view(market["event"]["countryCode"]));
					markets_.push({ m_id, Market_Projection{m_tm, event_type, country_code} });
				}
			} catch (boost::system::system_error e) {
				spdlog::error(e.what());
			} catch (...) {
				spdlog::error("invalid config info");
				throw std::exception();
			}
		}
		data_cond_.notify_all();
		std::this_thread::sleep_for(std::chrono::seconds(calc_time()));
	}
}